

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O0

void google::protobuf::TestUtilLite::ExpectAllFieldsSet(TestAllTypesLite *message)

{
  bool bVar1;
  char *pcVar2;
  TestAllTypesLite_OptionalGroup *pTVar3;
  TestAllTypesLite_NestedMessage *pTVar4;
  ForeignMessageLite *pFVar5;
  ImportMessageLite *pIVar6;
  PublicImportMessageLite *pPVar7;
  string *psVar8;
  TestAllTypesLite_RepeatedGroup *pTVar9;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar10;
  char *in_R9;
  AssertHelper local_21b8;
  Message local_21b0;
  undefined1 local_21a8 [8];
  AssertionResult gtest_ar_110;
  AssertHelper local_2178;
  Message local_2170;
  bool local_2161;
  undefined1 local_2160 [8];
  AssertionResult gtest_ar__55;
  AssertHelper local_2130;
  Message local_2128;
  bool local_2119;
  undefined1 local_2118 [8];
  AssertionResult gtest_ar__54;
  AssertHelper local_20e8;
  Message local_20e0;
  bool local_20d1;
  undefined1 local_20d0 [8];
  AssertionResult gtest_ar__53;
  AssertHelper local_20a0;
  Message local_2098;
  bool local_2089;
  undefined1 local_2088 [8];
  AssertionResult gtest_ar__52;
  Message local_2070;
  ImportEnumLite local_2068 [2];
  undefined1 local_2060 [8];
  AssertionResult gtest_ar_109;
  Message local_2048;
  ForeignEnumLite local_2040 [2];
  undefined1 local_2038 [8];
  AssertionResult gtest_ar_108;
  Message local_2020;
  TestAllTypesLite_NestedEnum local_2014;
  undefined1 local_2010 [8];
  AssertionResult gtest_ar_107;
  Message local_1ff8;
  undefined1 local_1ff0 [8];
  AssertionResult gtest_ar_106;
  Message local_1fd8;
  undefined1 local_1fd0 [8];
  AssertionResult gtest_ar_105;
  AssertHelper local_1fa0;
  Message local_1f98;
  bool local_1f89;
  undefined1 local_1f88 [8];
  AssertionResult gtest_ar__51;
  Message local_1f70;
  double local_1f68;
  int local_1f5c;
  undefined1 local_1f58 [8];
  AssertionResult gtest_ar_104;
  Message local_1f40;
  float local_1f38;
  int local_1f34;
  undefined1 local_1f30 [8];
  AssertionResult gtest_ar_103;
  Message local_1f18;
  int64_t local_1f10;
  int local_1f04;
  undefined1 local_1f00 [8];
  AssertionResult gtest_ar_102;
  Message local_1ee8;
  int32_t local_1ee0;
  int local_1edc;
  undefined1 local_1ed8 [8];
  AssertionResult gtest_ar_101;
  Message local_1ec0;
  uint64_t local_1eb8;
  int local_1eac;
  undefined1 local_1ea8 [8];
  AssertionResult gtest_ar_100;
  Message local_1e90;
  uint32_t local_1e88 [2];
  undefined1 local_1e80 [8];
  AssertionResult gtest_ar_99;
  Message local_1e68;
  int64_t local_1e60;
  int local_1e54;
  undefined1 local_1e50 [8];
  AssertionResult gtest_ar_98;
  Message local_1e38;
  int32_t local_1e30;
  int local_1e2c;
  undefined1 local_1e28 [8];
  AssertionResult gtest_ar_97;
  Message local_1e10;
  uint64_t local_1e08;
  int local_1dfc;
  undefined1 local_1df8 [8];
  AssertionResult gtest_ar_96;
  Message local_1de0;
  uint32_t local_1dd8 [2];
  undefined1 local_1dd0 [8];
  AssertionResult gtest_ar_95;
  Message local_1db8;
  int64_t local_1db0;
  int local_1da4;
  undefined1 local_1da0 [8];
  AssertionResult gtest_ar_94;
  Message local_1d88;
  int32_t local_1d80;
  int local_1d7c;
  undefined1 local_1d78 [8];
  AssertionResult gtest_ar_93;
  AssertHelper local_1d48;
  Message local_1d40;
  bool local_1d31;
  undefined1 local_1d30 [8];
  AssertionResult gtest_ar__50;
  AssertHelper local_1d00;
  Message local_1cf8;
  bool local_1ce9;
  undefined1 local_1ce8 [8];
  AssertionResult gtest_ar__49;
  AssertHelper local_1cb8;
  Message local_1cb0;
  bool local_1ca1;
  undefined1 local_1ca0 [8];
  AssertionResult gtest_ar__48;
  AssertHelper local_1c70;
  Message local_1c68;
  bool local_1c59;
  undefined1 local_1c58 [8];
  AssertionResult gtest_ar__47;
  AssertHelper local_1c28;
  Message local_1c20;
  bool local_1c11;
  undefined1 local_1c10 [8];
  AssertionResult gtest_ar__46;
  AssertHelper local_1be0;
  Message local_1bd8;
  bool local_1bc9;
  undefined1 local_1bc8 [8];
  AssertionResult gtest_ar__45;
  AssertHelper local_1b98;
  Message local_1b90;
  bool local_1b81;
  undefined1 local_1b80 [8];
  AssertionResult gtest_ar__44;
  AssertHelper local_1b50;
  Message local_1b48;
  bool local_1b39;
  undefined1 local_1b38 [8];
  AssertionResult gtest_ar__43;
  AssertHelper local_1b08;
  Message local_1b00;
  bool local_1af1;
  undefined1 local_1af0 [8];
  AssertionResult gtest_ar__42;
  AssertHelper local_1ac0;
  Message local_1ab8;
  bool local_1aa9;
  undefined1 local_1aa8 [8];
  AssertionResult gtest_ar__41;
  AssertHelper local_1a78;
  Message local_1a70;
  bool local_1a61;
  undefined1 local_1a60 [8];
  AssertionResult gtest_ar__40;
  AssertHelper local_1a30;
  Message local_1a28;
  bool local_1a19;
  undefined1 local_1a18 [8];
  AssertionResult gtest_ar__39;
  AssertHelper local_19e8;
  Message local_19e0;
  bool local_19d1;
  undefined1 local_19d0 [8];
  AssertionResult gtest_ar__38;
  AssertHelper local_19a0;
  Message local_1998;
  bool local_1989;
  undefined1 local_1988 [8];
  AssertionResult gtest_ar__37;
  AssertHelper local_1958;
  Message local_1950;
  bool local_1941;
  undefined1 local_1940 [8];
  AssertionResult gtest_ar__36;
  AssertHelper local_1910;
  Message local_1908;
  bool local_18f9;
  undefined1 local_18f8 [8];
  AssertionResult gtest_ar__35;
  AssertHelper local_18c8;
  Message local_18c0;
  bool local_18b1;
  undefined1 local_18b0 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_1880;
  Message local_1878;
  bool local_1869;
  undefined1 local_1868 [8];
  AssertionResult gtest_ar__33;
  Message local_1850;
  ImportEnumLite local_1848 [2];
  undefined1 local_1840 [8];
  AssertionResult gtest_ar_92;
  Message local_1828;
  ForeignEnumLite local_1820 [2];
  undefined1 local_1818 [8];
  AssertionResult gtest_ar_91;
  Message local_1800;
  TestAllTypesLite_NestedEnum local_17f4;
  undefined1 local_17f0 [8];
  AssertionResult gtest_ar_90;
  Message local_17d8;
  int32_t local_17d0;
  int local_17cc;
  undefined1 local_17c8 [8];
  AssertionResult gtest_ar_89;
  Message local_17b0;
  int32_t local_17a8;
  int local_17a4;
  undefined1 local_17a0 [8];
  AssertionResult gtest_ar_88;
  Message local_1788;
  int local_1780 [2];
  undefined1 local_1778 [8];
  AssertionResult gtest_ar_87;
  Message local_1760;
  int32_t local_1758;
  int local_1754;
  undefined1 local_1750 [8];
  AssertionResult gtest_ar_86;
  Message local_1738;
  int32_t local_1730;
  int local_172c;
  undefined1 local_1728 [8];
  AssertionResult gtest_ar_85;
  Message local_1710;
  undefined1 local_1708 [8];
  AssertionResult gtest_ar_84;
  Message local_16f0;
  undefined1 local_16e8 [8];
  AssertionResult gtest_ar_83;
  AssertHelper local_16b8;
  Message local_16b0;
  bool local_16a1;
  undefined1 local_16a0 [8];
  AssertionResult gtest_ar__32;
  Message local_1688;
  double local_1680;
  int local_1674;
  undefined1 local_1670 [8];
  AssertionResult gtest_ar_82;
  Message local_1658;
  float local_1650;
  int local_164c;
  undefined1 local_1648 [8];
  AssertionResult gtest_ar_81;
  Message local_1630;
  int64_t local_1628;
  int local_161c;
  undefined1 local_1618 [8];
  AssertionResult gtest_ar_80;
  Message local_1600;
  int32_t local_15f8;
  int local_15f4;
  undefined1 local_15f0 [8];
  AssertionResult gtest_ar_79;
  Message local_15d8;
  uint64_t local_15d0;
  int local_15c4;
  undefined1 local_15c0 [8];
  AssertionResult gtest_ar_78;
  Message local_15a8;
  uint32_t local_15a0 [2];
  undefined1 local_1598 [8];
  AssertionResult gtest_ar_77;
  Message local_1580;
  int64_t local_1578;
  int local_156c;
  undefined1 local_1568 [8];
  AssertionResult gtest_ar_76;
  Message local_1550;
  int32_t local_1548;
  int local_1544;
  undefined1 local_1540 [8];
  AssertionResult gtest_ar_75;
  Message local_1528;
  uint64_t local_1520;
  int local_1514;
  undefined1 local_1510 [8];
  AssertionResult gtest_ar_74;
  Message local_14f8;
  uint32_t local_14f0 [2];
  undefined1 local_14e8 [8];
  AssertionResult gtest_ar_73;
  Message local_14d0;
  int64_t local_14c8;
  int local_14bc;
  undefined1 local_14b8 [8];
  AssertionResult gtest_ar_72;
  Message local_14a0;
  int32_t local_1498;
  int local_1494;
  undefined1 local_1490 [8];
  AssertionResult gtest_ar_71;
  Message local_1478;
  ImportEnumLite local_1470 [2];
  undefined1 local_1468 [8];
  AssertionResult gtest_ar_70;
  Message local_1450;
  ForeignEnumLite local_1448 [2];
  undefined1 local_1440 [8];
  AssertionResult gtest_ar_69;
  Message local_1428;
  TestAllTypesLite_NestedEnum local_141c;
  undefined1 local_1418 [8];
  AssertionResult gtest_ar_68;
  Message local_1400;
  int32_t local_13f8;
  int local_13f4;
  undefined1 local_13f0 [8];
  AssertionResult gtest_ar_67;
  Message local_13d8;
  int32_t local_13d0;
  int local_13cc;
  undefined1 local_13c8 [8];
  AssertionResult gtest_ar_66;
  Message local_13b0;
  int local_13a8 [2];
  undefined1 local_13a0 [8];
  AssertionResult gtest_ar_65;
  Message local_1388;
  int32_t local_1380;
  int local_137c;
  undefined1 local_1378 [8];
  AssertionResult gtest_ar_64;
  Message local_1360;
  int32_t local_1358;
  int local_1354;
  undefined1 local_1350 [8];
  AssertionResult gtest_ar_63;
  Message local_1338;
  undefined1 local_1330 [8];
  AssertionResult gtest_ar_62;
  Message local_1318;
  undefined1 local_1310 [8];
  AssertionResult gtest_ar_61;
  Message local_12f8;
  bool local_12ea;
  bool local_12e9;
  undefined1 local_12e8 [8];
  AssertionResult gtest_ar_60;
  Message local_12d0;
  double local_12c8;
  int local_12bc;
  undefined1 local_12b8 [8];
  AssertionResult gtest_ar_59;
  Message local_12a0;
  float local_1298;
  int local_1294;
  undefined1 local_1290 [8];
  AssertionResult gtest_ar_58;
  Message local_1278;
  int64_t local_1270;
  int local_1264;
  undefined1 local_1260 [8];
  AssertionResult gtest_ar_57;
  Message local_1248;
  int32_t local_1240;
  int local_123c;
  undefined1 local_1238 [8];
  AssertionResult gtest_ar_56;
  Message local_1220;
  uint64_t local_1218;
  int local_120c;
  undefined1 local_1208 [8];
  AssertionResult gtest_ar_55;
  Message local_11f0;
  uint32_t local_11e8 [2];
  undefined1 local_11e0 [8];
  AssertionResult gtest_ar_54;
  Message local_11c8;
  int64_t local_11c0;
  int local_11b4;
  undefined1 local_11b0 [8];
  AssertionResult gtest_ar_53;
  Message local_1198;
  int32_t local_1190;
  int local_118c;
  undefined1 local_1188 [8];
  AssertionResult gtest_ar_52;
  Message local_1170;
  uint64_t local_1168;
  int local_115c;
  undefined1 local_1158 [8];
  AssertionResult gtest_ar_51;
  Message local_1140;
  uint32_t local_1138 [2];
  undefined1 local_1130 [8];
  AssertionResult gtest_ar_50;
  Message local_1118;
  int64_t local_1110;
  int local_1104;
  undefined1 local_1100 [8];
  AssertionResult gtest_ar_49;
  Message local_10e8;
  int32_t local_10e0;
  int local_10dc;
  undefined1 local_10d8 [8];
  AssertionResult gtest_ar_48;
  Message local_10c0;
  int local_10b8 [2];
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar_47;
  Message local_1098;
  int local_1090 [2];
  undefined1 local_1088 [8];
  AssertionResult gtest_ar_46;
  Message local_1070;
  int local_1068 [2];
  undefined1 local_1060 [8];
  AssertionResult gtest_ar_45;
  Message local_1048;
  int local_1040 [2];
  undefined1 local_1038 [8];
  AssertionResult gtest_ar_44;
  Message local_1020;
  int local_1018 [2];
  undefined1 local_1010 [8];
  AssertionResult gtest_ar_43;
  Message local_ff8;
  int local_ff0 [2];
  undefined1 local_fe8 [8];
  AssertionResult gtest_ar_42;
  Message local_fd0;
  int local_fc8 [2];
  undefined1 local_fc0 [8];
  AssertionResult gtest_ar_41;
  Message local_fa8;
  int local_fa0 [2];
  undefined1 local_f98 [8];
  AssertionResult gtest_ar_40;
  Message local_f80;
  int local_f78 [2];
  undefined1 local_f70 [8];
  AssertionResult gtest_ar_39;
  Message local_f58;
  int local_f50 [2];
  undefined1 local_f48 [8];
  AssertionResult gtest_ar_38;
  Message local_f30;
  int local_f28 [2];
  undefined1 local_f20 [8];
  AssertionResult gtest_ar_37;
  Message local_f08;
  int local_f00 [2];
  undefined1 local_ef8 [8];
  AssertionResult gtest_ar_36;
  Message local_ee0;
  int local_ed8 [2];
  undefined1 local_ed0 [8];
  AssertionResult gtest_ar_35;
  Message local_eb8;
  int local_eb0 [2];
  undefined1 local_ea8 [8];
  AssertionResult gtest_ar_34;
  Message local_e90;
  int local_e88 [2];
  undefined1 local_e80 [8];
  AssertionResult gtest_ar_33;
  Message local_e68;
  int local_e60 [2];
  undefined1 local_e58 [8];
  AssertionResult gtest_ar_32;
  Message local_e40;
  int local_e38 [2];
  undefined1 local_e30 [8];
  AssertionResult gtest_ar_31;
  Message local_e18;
  int local_e10 [2];
  undefined1 local_e08 [8];
  AssertionResult gtest_ar_30;
  Message local_df0;
  int local_de8 [2];
  undefined1 local_de0 [8];
  AssertionResult gtest_ar_29;
  Message local_dc8;
  int local_dc0 [2];
  undefined1 local_db8 [8];
  AssertionResult gtest_ar_28;
  Message local_da0;
  int local_d98 [2];
  undefined1 local_d90 [8];
  AssertionResult gtest_ar_27;
  Message local_d78;
  int local_d70 [2];
  undefined1 local_d68 [8];
  AssertionResult gtest_ar_26;
  AssertHelper local_d50;
  Message local_d48;
  int local_d40 [2];
  undefined1 local_d38 [8];
  AssertionResult gtest_ar_25;
  Message local_d20;
  ImportEnumLite local_d18 [2];
  undefined1 local_d10 [8];
  AssertionResult gtest_ar_24;
  Message local_cf8;
  ForeignEnumLite local_cf0 [2];
  undefined1 local_ce8 [8];
  AssertionResult gtest_ar_23;
  Message local_cd0;
  TestAllTypesLite_NestedEnum local_cc4;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar_22;
  Message local_ca8;
  int32_t local_ca0;
  int local_c9c;
  undefined1 local_c98 [8];
  AssertionResult gtest_ar_21;
  Message local_c80;
  int32_t local_c78;
  int local_c74;
  undefined1 local_c70 [8];
  AssertionResult gtest_ar_20;
  Message local_c58;
  int32_t local_c50;
  int local_c4c;
  undefined1 local_c48 [8];
  AssertionResult gtest_ar_19;
  Message local_c30;
  int32_t local_c28;
  int local_c24;
  undefined1 local_c20 [8];
  AssertionResult gtest_ar_18;
  Message local_c08;
  int local_c00 [2];
  undefined1 local_bf8 [8];
  AssertionResult gtest_ar_17;
  Message local_be0;
  int32_t local_bd8;
  int local_bd4;
  undefined1 local_bd0 [8];
  AssertionResult gtest_ar_16;
  Message local_bb8;
  int32_t local_bb0;
  int local_bac;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar_15;
  Message local_b90;
  undefined1 local_b88 [8];
  AssertionResult gtest_ar_14;
  Message local_b70;
  undefined1 local_b68 [8];
  AssertionResult gtest_ar_13;
  Message local_b50;
  bool local_b42;
  bool local_b41;
  undefined1 local_b40 [8];
  AssertionResult gtest_ar_12;
  Message local_b28;
  double local_b20;
  int local_b14;
  undefined1 local_b10 [8];
  AssertionResult gtest_ar_11;
  Message local_af8;
  float local_af0;
  int local_aec;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar_10;
  Message local_ad0;
  int64_t local_ac8;
  int local_abc;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar_9;
  Message local_aa0;
  int32_t local_a98;
  int local_a94;
  undefined1 local_a90 [8];
  AssertionResult gtest_ar_8;
  Message local_a78;
  uint64_t local_a70;
  int local_a64;
  undefined1 local_a60 [8];
  AssertionResult gtest_ar_7;
  Message local_a48;
  uint32_t local_a40 [2];
  undefined1 local_a38 [8];
  AssertionResult gtest_ar_6;
  Message local_a20;
  int64_t local_a18;
  int local_a0c;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar_5;
  Message local_9f0;
  int32_t local_9e8;
  int local_9e4;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar_4;
  Message local_9c8;
  uint64_t local_9c0;
  int local_9b4;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_3;
  Message local_998;
  uint32_t local_990 [2];
  undefined1 local_988 [8];
  AssertionResult gtest_ar_2;
  Message local_970;
  int64_t local_968;
  int local_95c;
  undefined1 local_958 [8];
  AssertionResult gtest_ar_1;
  Message local_940;
  int32_t local_938;
  int local_934;
  undefined1 local_930 [8];
  AssertionResult gtest_ar;
  AssertHelper local_900;
  Message local_8f8;
  bool local_8e9;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_8b8;
  Message local_8b0;
  bool local_8a1;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_870;
  Message local_868;
  bool local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_828;
  Message local_820;
  bool local_811;
  undefined1 local_810 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_7e0;
  Message local_7d8;
  bool local_7c9;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_798;
  Message local_790;
  bool local_781;
  undefined1 local_780 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_750;
  Message local_748;
  bool local_739;
  undefined1 local_738 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_708;
  Message local_700;
  bool local_6f1;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_6c0;
  Message local_6b8;
  bool local_6a9;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_678;
  Message local_670;
  bool local_661;
  undefined1 local_660 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_630;
  Message local_628;
  bool local_619;
  undefined1 local_618 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_5e8;
  Message local_5e0;
  bool local_5d1;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_5a0;
  Message local_598;
  bool local_589;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_558;
  Message local_550;
  bool local_541;
  undefined1 local_540 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_510;
  Message local_508;
  bool local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_4c8;
  Message local_4c0;
  bool local_4b1;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_480;
  Message local_478;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_438;
  Message local_430;
  bool local_421;
  undefined1 local_420 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_3f0;
  Message local_3e8;
  bool local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_3a8;
  Message local_3a0;
  bool local_391;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_360;
  Message local_358;
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_318;
  Message local_310;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_240;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_1f8;
  Message local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b0;
  Message local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_48;
  Message local_40 [3];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  TestAllTypesLite *message_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )message;
  local_21 = proto2_unittest::TestAllTypesLite::has_optional_int32(message);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"message.has_optional_int32()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_79 = proto2_unittest::TestAllTypesLite::has_optional_int64
                       ((TestAllTypesLite *)
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_78,
               (AssertionResult *)"message.has_optional_int64()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_c1 = proto2_unittest::TestAllTypesLite::has_optional_uint32
                       ((TestAllTypesLite *)
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_c0,
               (AssertionResult *)"message.has_optional_uint32()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_109 = proto2_unittest::TestAllTypesLite::has_optional_uint64
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_108,
               (AssertionResult *)"message.has_optional_uint64()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_151 = proto2_unittest::TestAllTypesLite::has_optional_sint32
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_150,
               (AssertionResult *)"message.has_optional_sint32()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_199 = proto2_unittest::TestAllTypesLite::has_optional_sint64
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_198,
               (AssertionResult *)"message.has_optional_sint64()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1e1 = proto2_unittest::TestAllTypesLite::has_optional_fixed32
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_1e0,
               (AssertionResult *)"message.has_optional_fixed32()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_229 = proto2_unittest::TestAllTypesLite::has_optional_fixed64
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_228,&local_229,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_228,
               (AssertionResult *)"message.has_optional_fixed64()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_271 = proto2_unittest::TestAllTypesLite::has_optional_sfixed32
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_270,&local_271,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_270,
               (AssertionResult *)"message.has_optional_sfixed32()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_2b9 = proto2_unittest::TestAllTypesLite::has_optional_sfixed64
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_2b8,
               (AssertionResult *)"message.has_optional_sfixed64()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_301 = proto2_unittest::TestAllTypesLite::has_optional_float
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_300,&local_301,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_300,
               (AssertionResult *)"message.has_optional_float()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_349 = proto2_unittest::TestAllTypesLite::has_optional_double
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_348,&local_349,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_348,
               (AssertionResult *)"message.has_optional_double()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  local_391 = proto2_unittest::TestAllTypesLite::has_optional_bool
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_390,&local_391,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_390,
               (AssertionResult *)"message.has_optional_bool()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_3d9 = proto2_unittest::TestAllTypesLite::has_optional_string
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d8,&local_3d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_3d8,
               (AssertionResult *)"message.has_optional_string()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  local_421 = proto2_unittest::TestAllTypesLite::has_optional_bytes
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_420,&local_421,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_420,
               (AssertionResult *)"message.has_optional_bytes()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  local_469 = proto2_unittest::TestAllTypesLite::has_optionalgroup
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_468,&local_469,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_468,
               (AssertionResult *)"message.has_optionalgroup()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  local_4b1 = proto2_unittest::TestAllTypesLite::has_optional_nested_message
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4b0,&local_4b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_4b0,
               (AssertionResult *)"message.has_optional_nested_message()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4c8);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4f9 = proto2_unittest::TestAllTypesLite::has_optional_foreign_message
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f8,&local_4f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_4f8,
               (AssertionResult *)"message.has_optional_foreign_message()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xbe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_510,&local_508);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_541 = proto2_unittest::TestAllTypesLite::has_optional_import_message
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_540,&local_541,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_540,
               (AssertionResult *)"message.has_optional_import_message()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xbf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  local_589 = proto2_unittest::TestAllTypesLite::has_optional_public_import_message
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_588,&local_589,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_588,
               (AssertionResult *)"message.has_optional_public_import_message()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  local_5d1 = proto2_unittest::TestAllTypesLite::has_optional_lazy_message
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5d0,&local_5d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_5d0,
               (AssertionResult *)"message.has_optional_lazy_message()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  local_619 = proto2_unittest::TestAllTypesLite::has_optional_unverified_lazy_message
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_618,&local_619,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_618,
               (AssertionResult *)"message.has_optional_unverified_lazy_message()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_630,&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  pTVar3 = proto2_unittest::TestAllTypesLite::optionalgroup
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_661 = proto2_unittest::TestAllTypesLite_OptionalGroup::has_a(pTVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_660,&local_661,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar1) {
    testing::Message::Message(&local_670);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_660,
               (AssertionResult *)"message.optionalgroup().has_a()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_678,&local_670);
    testing::internal::AssertHelper::~AssertHelper(&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  pTVar4 = proto2_unittest::TestAllTypesLite::optional_nested_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_6a9 = proto2_unittest::TestAllTypesLite_NestedMessage::has_bb(pTVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6a8,&local_6a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_6a8,
               (AssertionResult *)"message.optional_nested_message().has_bb()","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  pFVar5 = proto2_unittest::TestAllTypesLite::optional_foreign_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_6f1 = proto2_unittest::ForeignMessageLite::has_c(pFVar5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6f0,&local_6f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_6f0,
               (AssertionResult *)"message.optional_foreign_message().has_c()","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_708,&local_700);
    testing::internal::AssertHelper::~AssertHelper(&local_708);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  pIVar6 = proto2_unittest::TestAllTypesLite::optional_import_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_739 = proto2_unittest_import::ImportMessageLite::has_d(pIVar6);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_738,&local_739,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    testing::Message::Message(&local_748);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_738,
               (AssertionResult *)"message.optional_import_message().has_d()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,199,pcVar2);
    testing::internal::AssertHelper::operator=(&local_750,&local_748);
    testing::internal::AssertHelper::~AssertHelper(&local_750);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  pPVar7 = proto2_unittest::TestAllTypesLite::optional_public_import_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_781 = proto2_unittest_import::PublicImportMessageLite::has_e(pPVar7);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_780,&local_781,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(&local_790);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_780,
               (AssertionResult *)"message.optional_public_import_message().has_e()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,200,pcVar2);
    testing::internal::AssertHelper::operator=(&local_798,&local_790);
    testing::internal::AssertHelper::~AssertHelper(&local_798);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  pTVar4 = proto2_unittest::TestAllTypesLite::optional_lazy_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_7c9 = proto2_unittest::TestAllTypesLite_NestedMessage::has_bb(pTVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c8,&local_7c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar1) {
    testing::Message::Message(&local_7d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_7c8,
               (AssertionResult *)"message.optional_lazy_message().has_bb()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  pTVar4 = proto2_unittest::TestAllTypesLite::optional_unverified_lazy_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_811 = proto2_unittest::TestAllTypesLite_NestedMessage::has_bb(pTVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_810,&local_811,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    testing::Message::Message(&local_820);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__29.message_,(internal *)local_810,
               (AssertionResult *)"message.optional_unverified_lazy_message().has_bb()","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_828,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xca,pcVar2);
    testing::internal::AssertHelper::operator=(&local_828,&local_820);
    testing::internal::AssertHelper::~AssertHelper(&local_828);
    std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_820);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  local_859 = proto2_unittest::TestAllTypesLite::has_optional_nested_enum
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_858,&local_859,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar1) {
    testing::Message::Message(&local_868);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_858,
               (AssertionResult *)"message.has_optional_nested_enum()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_870,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xcc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_870,&local_868);
    testing::internal::AssertHelper::~AssertHelper(&local_870);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  local_8a1 = proto2_unittest::TestAllTypesLite::has_optional_foreign_enum
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8a0,&local_8a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__31.message_,(internal *)local_8a0,
               (AssertionResult *)"message.has_optional_foreign_enum()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xcd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  local_8e9 = proto2_unittest::TestAllTypesLite::has_optional_import_enum
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8e8,&local_8e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_8e8,
               (AssertionResult *)"message.has_optional_import_enum()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=(&local_900,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper(&local_900);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  local_934 = 0x65;
  local_938 = proto2_unittest::TestAllTypesLite::optional_int32
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_930,"101","message.optional_int32()",&local_934,&local_938);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar1) {
    testing::Message::Message(&local_940);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_930);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_940);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  local_95c = 0x66;
  local_968 = proto2_unittest::TestAllTypesLite::optional_int64
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_958,"102","message.optional_int64()",&local_95c,&local_968);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_958);
  if (!bVar1) {
    testing::Message::Message(&local_970);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_958);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_970);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_970);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
  local_990[1] = 0x67;
  local_990[0] = proto2_unittest::TestAllTypesLite::optional_uint32
                           ((TestAllTypesLite *)
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_988,"103","message.optional_uint32()",(int *)(local_990 + 1),
             local_990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
  if (!bVar1) {
    testing::Message::Message(&local_998);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_998);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
  local_9b4 = 0x68;
  local_9c0 = proto2_unittest::TestAllTypesLite::optional_uint64
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_9b0,"104","message.optional_uint64()",&local_9b4,&local_9c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar1) {
    testing::Message::Message(&local_9c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_9c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  local_9e4 = 0x69;
  local_9e8 = proto2_unittest::TestAllTypesLite::optional_sint32
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9e0,"105","message.optional_sint32()",&local_9e4,&local_9e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
  if (!bVar1) {
    testing::Message::Message(&local_9f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
  local_a0c = 0x6a;
  local_a18 = proto2_unittest::TestAllTypesLite::optional_sint64
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_a08,"106","message.optional_sint64()",&local_a0c,&local_a18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_a20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  local_a40[1] = 0x6b;
  local_a40[0] = proto2_unittest::TestAllTypesLite::optional_fixed32
                           ((TestAllTypesLite *)
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_a38,"107","message.optional_fixed32()",(int *)(local_a40 + 1),
             local_a40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
  if (!bVar1) {
    testing::Message::Message(&local_a48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_a48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
  local_a64 = 0x6c;
  local_a70 = proto2_unittest::TestAllTypesLite::optional_fixed64
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_a60,"108","message.optional_fixed64()",&local_a64,&local_a70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a60);
  if (!bVar1) {
    testing::Message::Message(&local_a78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_a78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a60);
  local_a94 = 0x6d;
  local_a98 = proto2_unittest::TestAllTypesLite::optional_sfixed32
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a90,"109","message.optional_sfixed32()",&local_a94,&local_a98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a90);
  if (!bVar1) {
    testing::Message::Message(&local_aa0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xd9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_aa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a90);
  local_abc = 0x6e;
  local_ac8 = proto2_unittest::TestAllTypesLite::optional_sfixed64
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_ab8,"110","message.optional_sfixed64()",&local_abc,&local_ac8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab8);
  if (!bVar1) {
    testing::Message::Message(&local_ad0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ab8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xda,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_ad0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_ad0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
  local_aec = 0x6f;
  local_af0 = proto2_unittest::TestAllTypesLite::optional_float
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_float,_nullptr>
            ((EqHelper *)local_ae8,"111","message.optional_float()",&local_aec,&local_af0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
  if (!bVar1) {
    testing::Message::Message(&local_af8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xdb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_af8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_af8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
  local_b14 = 0x70;
  local_b20 = proto2_unittest::TestAllTypesLite::optional_double
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((EqHelper *)local_b10,"112","message.optional_double()",&local_b14,&local_b20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b10);
  if (!bVar1) {
    testing::Message::Message(&local_b28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xdc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_b28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_b28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b10);
  local_b41 = true;
  local_b42 = proto2_unittest::TestAllTypesLite::optional_bool
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_b40,"true","message.optional_bool()",&local_b41,&local_b42);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b40);
  if (!bVar1) {
    testing::Message::Message(&local_b50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xdd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_b50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_b50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b40);
  psVar8 = proto2_unittest::TestAllTypesLite::optional_string_abi_cxx11_
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_b68,"\"115\"","message.optional_string()",(char (*) [4])"115",psVar8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b68);
  if (!bVar1) {
    testing::Message::Message(&local_b70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_b70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_b70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b68);
  psVar8 = proto2_unittest::TestAllTypesLite::optional_bytes_abi_cxx11_
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_b88,"\"116\"","message.optional_bytes()",(char (*) [4])"116",psVar8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b88);
  if (!bVar1) {
    testing::Message::Message(&local_b90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xdf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_b90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b88);
  local_bac = 0x75;
  pTVar3 = proto2_unittest::TestAllTypesLite::optionalgroup
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_bb0 = proto2_unittest::TestAllTypesLite_OptionalGroup::a(pTVar3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_ba8,"117","message.optionalgroup().a()",&local_bac,&local_bb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba8);
  if (!bVar1) {
    testing::Message::Message(&local_bb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_bb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_bb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
  local_bd4 = 0x76;
  pTVar4 = proto2_unittest::TestAllTypesLite::optional_nested_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_bd8 = proto2_unittest::TestAllTypesLite_NestedMessage::bb(pTVar4);
  pcVar2 = "118";
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_bd0,"118","message.optional_nested_message().bb()",&local_bd4,
             &local_bd8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd0);
  if (!bVar1) {
    testing::Message::Message(&local_be0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe2,pcVar2);
    pcVar2 = (char *)&local_be0;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_17.message_,(Message *)pcVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd0);
  local_c00[1] = 0x77;
  pFVar5 = proto2_unittest::TestAllTypesLite::optional_foreign_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_c00[0] = proto2_unittest::ForeignMessageLite::c(pFVar5,pcVar2,extraout_RDX);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_bf8,"119","message.optional_foreign_message().c()",local_c00 + 1,
             local_c00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf8);
  if (!bVar1) {
    testing::Message::Message(&local_c08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bf8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_c08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_c08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf8);
  local_c24 = 0x78;
  pIVar6 = proto2_unittest::TestAllTypesLite::optional_import_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_c28 = proto2_unittest_import::ImportMessageLite::d(pIVar6);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c20,"120","message.optional_import_message().d()",&local_c24,
             &local_c28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c20);
  if (!bVar1) {
    testing::Message::Message(&local_c30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_c30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_c30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c20);
  local_c4c = 0x7e;
  pPVar7 = proto2_unittest::TestAllTypesLite::optional_public_import_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_c50 = proto2_unittest_import::PublicImportMessageLite::e(pPVar7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c48,"126","message.optional_public_import_message().e()",&local_c4c,
             &local_c50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar1) {
    testing::Message::Message(&local_c58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_c58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  local_c74 = 0x7f;
  pTVar4 = proto2_unittest::TestAllTypesLite::optional_lazy_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_c78 = proto2_unittest::TestAllTypesLite_NestedMessage::bb(pTVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c70,"127","message.optional_lazy_message().bb()",&local_c74,
             &local_c78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
  if (!bVar1) {
    testing::Message::Message(&local_c80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_c80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_c80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
  local_c9c = 0x80;
  pTVar4 = proto2_unittest::TestAllTypesLite::optional_unverified_lazy_message
                     ((TestAllTypesLite *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_ca0 = proto2_unittest::TestAllTypesLite_NestedMessage::bb(pTVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c98,"128","message.optional_unverified_lazy_message().bb()",
             &local_c9c,&local_ca0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c98);
  if (!bVar1) {
    testing::Message::Message(&local_ca8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_ca8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_ca8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c98);
  local_cc4 = proto2_unittest::TestAllTypesLite::optional_nested_enum
                        ((TestAllTypesLite *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::
  Compare<proto2_unittest::TestAllTypesLite_NestedEnum,_proto2_unittest::TestAllTypesLite_NestedEnum,_nullptr>
            ((EqHelper *)local_cc0,"unittest::TestAllTypesLite::BAZ",
             "message.optional_nested_enum()",&proto2_unittest::TestAllTypesLite::BAZ,&local_cc4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc0);
  if (!bVar1) {
    testing::Message::Message(&local_cd0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_cd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_cd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc0);
  local_cf0[1] = 6;
  local_cf0[0] = proto2_unittest::TestAllTypesLite::optional_foreign_enum
                           ((TestAllTypesLite *)
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  testing::internal::EqHelper::
  Compare<proto2_unittest::ForeignEnumLite,_proto2_unittest::ForeignEnumLite,_nullptr>
            ((EqHelper *)local_ce8,"unittest::FOREIGN_LITE_BAZ","message.optional_foreign_enum()",
             local_cf0 + 1,local_cf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce8);
  if (!bVar1) {
    testing::Message::Message(&local_cf8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ce8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_cf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce8);
  local_d18[1] = 9;
  local_d18[0] = proto2_unittest::TestAllTypesLite::optional_import_enum
                           ((TestAllTypesLite *)
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  testing::internal::EqHelper::
  Compare<proto2_unittest_import::ImportEnumLite,_proto2_unittest_import::ImportEnumLite,_nullptr>
            ((EqHelper *)local_d10,"unittest_import::IMPORT_LITE_BAZ",
             "message.optional_import_enum()",local_d18 + 1,local_d18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d10);
  if (!bVar1) {
    testing::Message::Message(&local_d20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_d20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d10);
  local_d40[1] = 2;
  local_d40[0] = proto2_unittest::TestAllTypesLite::repeated_int32_size
                           ((TestAllTypesLite *)
                            gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_d38,"2","message.repeated_int32_size()",local_d40 + 1,local_d40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d38);
  if (!bVar1) {
    testing::Message::Message(&local_d48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d38);
    testing::internal::AssertHelper::AssertHelper
              (&local_d50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d50,&local_d48);
    testing::internal::AssertHelper::~AssertHelper(&local_d50);
    testing::Message::~Message(&local_d48);
  }
  gtest_ar_26.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_26.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d38);
  if (gtest_ar_26.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_d70[1] = 2;
    local_d70[0] = proto2_unittest::TestAllTypesLite::repeated_int64_size
                             ((TestAllTypesLite *)
                              gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_d68,"2","message.repeated_int64_size()",local_d70 + 1,local_d70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d68);
    if (!bVar1) {
      testing::Message::Message(&local_d78);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_27.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                 ,0xf1,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_d78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
      testing::Message::~Message(&local_d78);
    }
    gtest_ar_26.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_26.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d68);
    if (gtest_ar_26.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_d98[1] = 2;
      local_d98[0] = proto2_unittest::TestAllTypesLite::repeated_uint32_size
                               ((TestAllTypesLite *)
                                gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_d90,"2","message.repeated_uint32_size()",local_d98 + 1,local_d98)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d90);
      if (!bVar1) {
        testing::Message::Message(&local_da0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d90);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_28.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                   ,0xf2,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_da0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
        testing::Message::~Message(&local_da0);
      }
      gtest_ar_26.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_26.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d90);
      if (gtest_ar_26.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_dc0[1] = 2;
        local_dc0[0] = proto2_unittest::TestAllTypesLite::repeated_uint64_size
                                 ((TestAllTypesLite *)
                                  gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_db8,"2","message.repeated_uint64_size()",local_dc0 + 1,
                   local_dc0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db8);
        if (!bVar1) {
          testing::Message::Message(&local_dc8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_db8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_29.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                     ,0xf3,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_29.message_,&local_dc8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
          testing::Message::~Message(&local_dc8);
        }
        gtest_ar_26.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_26.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_db8);
        if (gtest_ar_26.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_de8[1] = 2;
          local_de8[0] = proto2_unittest::TestAllTypesLite::repeated_sint32_size
                                   ((TestAllTypesLite *)
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_de0,"2","message.repeated_sint32_size()",local_de8 + 1,
                     local_de8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_de0);
          if (!bVar1) {
            testing::Message::Message(&local_df0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_de0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_30.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                       ,0xf4,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_30.message_,&local_df0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
            testing::Message::~Message(&local_df0);
          }
          gtest_ar_26.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_26.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_de0);
          if (gtest_ar_26.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_e10[1] = 2;
            local_e10[0] = proto2_unittest::TestAllTypesLite::repeated_sint64_size
                                     ((TestAllTypesLite *)
                                      gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_e08,"2","message.repeated_sint64_size()",local_e10 + 1,
                       local_e10);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e08);
            if (!bVar1) {
              testing::Message::Message(&local_e18);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e08);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_31.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                         ,0xf5,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_31.message_,&local_e18);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
              testing::Message::~Message(&local_e18);
            }
            gtest_ar_26.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_26.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_e08);
            if (gtest_ar_26.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_e38[1] = 2;
              local_e38[0] = proto2_unittest::TestAllTypesLite::repeated_fixed32_size
                                       ((TestAllTypesLite *)
                                        gtest_ar_.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_e30,"2","message.repeated_fixed32_size()",local_e38 + 1,
                         local_e38);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e30);
              if (!bVar1) {
                testing::Message::Message(&local_e40);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e30);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_32.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                           ,0xf6,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_32.message_,&local_e40);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_32.message_);
                testing::Message::~Message(&local_e40);
              }
              gtest_ar_26.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_26.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_e30);
              if (gtest_ar_26.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_e60[1] = 2;
                local_e60[0] = proto2_unittest::TestAllTypesLite::repeated_fixed64_size
                                         ((TestAllTypesLite *)
                                          gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_e58,"2","message.repeated_fixed64_size()",local_e60 + 1
                           ,local_e60);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_e58);
                if (!bVar1) {
                  testing::Message::Message(&local_e68);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e58);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_33.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                             ,0xf7,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_33.message_,&local_e68);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_33.message_);
                  testing::Message::~Message(&local_e68);
                }
                gtest_ar_26.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_26.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_e58);
                if (gtest_ar_26.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_e88[1] = 2;
                  local_e88[0] = proto2_unittest::TestAllTypesLite::repeated_sfixed32_size
                                           ((TestAllTypesLite *)
                                            gtest_ar_.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_e80,"2","message.repeated_sfixed32_size()",
                             local_e88 + 1,local_e88);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_e80);
                  if (!bVar1) {
                    testing::Message::Message(&local_e90);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e80)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_34.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                               ,0xf8,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_34.message_,&local_e90);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_34.message_);
                    testing::Message::~Message(&local_e90);
                  }
                  gtest_ar_26.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar_26.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e80);
                  if (gtest_ar_26.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    local_eb0[1] = 2;
                    local_eb0[0] = proto2_unittest::TestAllTypesLite::repeated_sfixed64_size
                                             ((TestAllTypesLite *)
                                              gtest_ar_.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_ea8,"2","message.repeated_sfixed64_size()",
                               local_eb0 + 1,local_eb0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_ea8);
                    if (!bVar1) {
                      testing::Message::Message(&local_eb8);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_ea8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_35.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                 ,0xf9,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_35.message_,&local_eb8);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_35.message_);
                      testing::Message::~Message(&local_eb8);
                    }
                    gtest_ar_26.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar_26.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea8);
                    if (gtest_ar_26.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_ed8[1] = 2;
                      local_ed8[0] = proto2_unittest::TestAllTypesLite::repeated_float_size
                                               ((TestAllTypesLite *)
                                                gtest_ar_.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_ed0,"2","message.repeated_float_size()",
                                 local_ed8 + 1,local_ed8);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_ed0);
                      if (!bVar1) {
                        testing::Message::Message(&local_ee0);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_ed0);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_36.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                   ,0xfa,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_36.message_,&local_ee0);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_36.message_);
                        testing::Message::~Message(&local_ee0);
                      }
                      gtest_ar_26.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar_26.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed0);
                      if (gtest_ar_26.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        local_f00[1] = 2;
                        local_f00[0] = proto2_unittest::TestAllTypesLite::repeated_double_size
                                                 ((TestAllTypesLite *)
                                                  gtest_ar_.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_ef8,"2","message.repeated_double_size()",
                                   local_f00 + 1,local_f00);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_ef8);
                        if (!bVar1) {
                          testing::Message::Message(&local_f08);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_ef8);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_37.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                     ,0xfb,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_37.message_,&local_f08);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_37.message_);
                          testing::Message::~Message(&local_f08);
                        }
                        gtest_ar_26.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar_26.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef8);
                        if (gtest_ar_26.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_f28[1] = 2;
                          local_f28[0] = proto2_unittest::TestAllTypesLite::repeated_bool_size
                                                   ((TestAllTypesLite *)
                                                    gtest_ar_.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_f20,"2","message.repeated_bool_size()",
                                     local_f28 + 1,local_f28);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_f20);
                          if (!bVar1) {
                            testing::Message::Message(&local_f30);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_f20);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_38.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                       ,0xfc,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_38.message_,&local_f30);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_38.message_);
                            testing::Message::~Message(&local_f30);
                          }
                          gtest_ar_26.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar_26.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_f20);
                          if (gtest_ar_26.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            local_f50[1] = 2;
                            local_f50[0] = proto2_unittest::TestAllTypesLite::repeated_string_size
                                                     ((TestAllTypesLite *)
                                                      gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((EqHelper *)local_f48,"2","message.repeated_string_size()",
                                       local_f50 + 1,local_f50);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_f48);
                            if (!bVar1) {
                              testing::Message::Message(&local_f58);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_f48);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_39.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                         ,0xfd,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_39.message_,&local_f58);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_39.message_);
                              testing::Message::~Message(&local_f58);
                            }
                            gtest_ar_26.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar_26.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_f48)
                            ;
                            if (gtest_ar_26.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              local_f78[1] = 2;
                              local_f78[0] = proto2_unittest::TestAllTypesLite::repeated_bytes_size
                                                       ((TestAllTypesLite *)
                                                        gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_f70,"2","message.repeated_bytes_size()",
                                         local_f78 + 1,local_f78);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_f70);
                              if (!bVar1) {
                                testing::Message::Message(&local_f80);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_f70);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_40.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                           ,0xfe,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_40.message_,&local_f80);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_40.message_);
                                testing::Message::~Message(&local_f80);
                              }
                              gtest_ar_26.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar_26.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_f70);
                              if (gtest_ar_26.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                local_fa0[1] = 2;
                                local_fa0[0] = proto2_unittest::TestAllTypesLite::repeatedgroup_size
                                                         ((TestAllTypesLite *)
                                                          gtest_ar_.message_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                          ((EqHelper *)local_f98,"2","message.repeatedgroup_size()",
                                           local_fa0 + 1,local_fa0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_f98);
                                if (!bVar1) {
                                  testing::Message::Message(&local_fa8);
                                  pcVar2 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_f98);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_41.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                             ,0x100,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_41.message_,&local_fa8);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_41.message_);
                                  testing::Message::~Message(&local_fa8);
                                }
                                gtest_ar_26.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar_26.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_f98);
                                if (gtest_ar_26.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  local_fc8[1] = 2;
                                  local_fc8[0] = proto2_unittest::TestAllTypesLite::
                                                 repeated_nested_message_size
                                                           ((TestAllTypesLite *)
                                                            gtest_ar_.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_fc0,"2",
                                             "message.repeated_nested_message_size()",local_fc8 + 1,
                                             local_fc8);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_fc0);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_fd0);
                                    pcVar2 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_fc0);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_42.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                               ,0x101,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_42.message_,&local_fd0);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_42.message_);
                                    testing::Message::~Message(&local_fd0);
                                  }
                                  gtest_ar_26.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar_26.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_fc0);
                                  if (gtest_ar_26.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    local_ff0[1] = 2;
                                    local_ff0[0] = proto2_unittest::TestAllTypesLite::
                                                   repeated_foreign_message_size
                                                             ((TestAllTypesLite *)
                                                              gtest_ar_.message_._M_t.
                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_fe8,"2",
                                               "message.repeated_foreign_message_size()",
                                               local_ff0 + 1,local_ff0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_fe8);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_ff8);
                                      pcVar2 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_fe8);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_43.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                 ,0x102,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_43.message_,&local_ff8);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_43.message_);
                                      testing::Message::~Message(&local_ff8);
                                    }
                                    gtest_ar_26.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._5_3_ = 0;
                                    gtest_ar_26.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_fe8);
                                    if (gtest_ar_26.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ == 0) {
                                      local_1018[1] = 2;
                                      local_1018[0] =
                                           proto2_unittest::TestAllTypesLite::
                                           repeated_import_message_size
                                                     ((TestAllTypesLite *)
                                                      gtest_ar_.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                ((EqHelper *)local_1010,"2",
                                                 "message.repeated_import_message_size()",
                                                 local_1018 + 1,local_1018);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_1010);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_1020);
                                        pcVar2 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_1010);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_44.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x103,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_44.message_,&local_1020
                                                  );
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_44.message_);
                                        testing::Message::~Message(&local_1020);
                                      }
                                      gtest_ar_26.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._5_3_ = 0;
                                      gtest_ar_26.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_1010);
                                      if (gtest_ar_26.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_ == 0) {
                                        local_1040[1] = 2;
                                        local_1040[0] =
                                             proto2_unittest::TestAllTypesLite::
                                             repeated_lazy_message_size
                                                       ((TestAllTypesLite *)
                                                        gtest_ar_.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                  ((EqHelper *)local_1038,"2",
                                                   "message.repeated_lazy_message_size()",
                                                   local_1040 + 1,local_1040);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_1038);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_1048);
                                          pcVar2 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_1038);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_45.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x104,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_45.message_,
                                                     &local_1048);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_45.message_);
                                          testing::Message::~Message(&local_1048);
                                        }
                                        gtest_ar_26.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._5_3_ = 0;
                                        gtest_ar_26.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_1038);
                                        if (gtest_ar_26.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ == 0) {
                                          local_1068[1] = 2;
                                          local_1068[0] =
                                               proto2_unittest::TestAllTypesLite::
                                               repeated_nested_enum_size
                                                         ((TestAllTypesLite *)
                                                          gtest_ar_.message_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                    ((EqHelper *)local_1060,"2",
                                                     "message.repeated_nested_enum_size()",
                                                     local_1068 + 1,local_1068);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_1060);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_1070);
                                            pcVar2 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_1060);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_46.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x105,pcVar2);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_46.message_,
                                                       &local_1070);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar_46.message_);
                                            testing::Message::~Message(&local_1070);
                                          }
                                          gtest_ar_26.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._5_3_ = 0;
                                          gtest_ar_26.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_1_ = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_1060);
                                          if (gtest_ar_26.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_4_ == 0) {
                                            local_1090[1] = 2;
                                            local_1090[0] =
                                                 proto2_unittest::TestAllTypesLite::
                                                 repeated_foreign_enum_size
                                                           ((TestAllTypesLite *)
                                                            gtest_ar_.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                      ((EqHelper *)local_1088,"2",
                                                       "message.repeated_foreign_enum_size()",
                                                       local_1090 + 1,local_1090);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_1088);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_1098);
                                              pcVar2 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)local_1088);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar_47.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x106,pcVar2);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar_47.message_,
                                                         &local_1098);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&gtest_ar_47.message_);
                                              testing::Message::~Message(&local_1098);
                                            }
                                            gtest_ar_26.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._5_3_ = 0;
                                            gtest_ar_26.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_1_ = !bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_1088);
                                            if (gtest_ar_26.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_4_ == 0) {
                                              local_10b8[1] = 2;
                                              local_10b8[0] =
                                                   proto2_unittest::TestAllTypesLite::
                                                   repeated_import_enum_size
                                                             ((TestAllTypesLite *)
                                                              gtest_ar_.message_._M_t.
                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                              testing::internal::EqHelper::
                                              Compare<int,_int,_nullptr>
                                                        ((EqHelper *)local_10b0,"2",
                                                         "message.repeated_import_enum_size()",
                                                         local_10b8 + 1,local_10b8);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_10b0);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_10c0);
                                                pcVar2 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)local_10b0);
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_48.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x107,pcVar2);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_48.message_,
                                                           &local_10c0);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          ((AssertHelper *)&gtest_ar_48.message_);
                                                testing::Message::~Message(&local_10c0);
                                              }
                                              gtest_ar_26.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._5_3_ = 0;
                                              gtest_ar_26.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_1_ = !bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_10b0);
                                              if (gtest_ar_26.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                local_10dc = 0xc9;
                                                local_10e0 = proto2_unittest::TestAllTypesLite::
                                                             repeated_int32((TestAllTypesLite *)
                                                                            gtest_ar_.message_._M_t.
                                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_10d8,"201",
                                                           "message.repeated_int32(0)",&local_10dc,
                                                           &local_10e0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_10d8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_10e8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_10d8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_49.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_49.message_,
                                                             &local_10e8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_49.message_);
                                                  testing::Message::~Message(&local_10e8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_10d8);
                                                local_1104 = 0xca;
                                                local_1110 = proto2_unittest::TestAllTypesLite::
                                                             repeated_int64((TestAllTypesLite *)
                                                                            gtest_ar_.message_._M_t.
                                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_long,_nullptr>
                                                          ((EqHelper *)local_1100,"202",
                                                           "message.repeated_int64(0)",&local_1104,
                                                           &local_1110);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1100);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1118);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1100)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_50.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_50.message_,
                                                             &local_1118);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_50.message_);
                                                  testing::Message::~Message(&local_1118);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1100);
                                                local_1138[1] = 0xcb;
                                                local_1138[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     repeated_uint32((TestAllTypesLite *)
                                                                     gtest_ar_.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_int,_nullptr>
                                                          ((EqHelper *)local_1130,"203",
                                                           "message.repeated_uint32(0)",
                                                           (int *)(local_1138 + 1),local_1138);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1130);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1140);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1130)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_51.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10c,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_51.message_,
                                                             &local_1140);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_51.message_);
                                                  testing::Message::~Message(&local_1140);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1130);
                                                local_115c = 0xcc;
                                                local_1168 = proto2_unittest::TestAllTypesLite::
                                                             repeated_uint64((TestAllTypesLite *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_long,_nullptr>
                                                          ((EqHelper *)local_1158,"204",
                                                           "message.repeated_uint64(0)",&local_115c,
                                                           &local_1168);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1158);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1170);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1158)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_52.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_52.message_,
                                                             &local_1170);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_52.message_);
                                                  testing::Message::~Message(&local_1170);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1158);
                                                local_118c = 0xcd;
                                                local_1190 = proto2_unittest::TestAllTypesLite::
                                                             repeated_sint32((TestAllTypesLite *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1188,"205",
                                                           "message.repeated_sint32(0)",&local_118c,
                                                           &local_1190);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1188);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1198);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1188)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_53.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_53.message_,
                                                             &local_1198);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_53.message_);
                                                  testing::Message::~Message(&local_1198);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1188);
                                                local_11b4 = 0xce;
                                                local_11c0 = proto2_unittest::TestAllTypesLite::
                                                             repeated_sint64((TestAllTypesLite *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_long,_nullptr>
                                                          ((EqHelper *)local_11b0,"206",
                                                           "message.repeated_sint64(0)",&local_11b4,
                                                           &local_11c0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_11b0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_11c8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_11b0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_54.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x10f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_54.message_,
                                                             &local_11c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_54.message_);
                                                  testing::Message::~Message(&local_11c8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_11b0);
                                                local_11e8[1] = 0xcf;
                                                local_11e8[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     repeated_fixed32((TestAllTypesLite *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_int,_nullptr>
                                                          ((EqHelper *)local_11e0,"207",
                                                           "message.repeated_fixed32(0)",
                                                           (int *)(local_11e8 + 1),local_11e8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_11e0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_11f0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_11e0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_55.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x110,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_55.message_,
                                                             &local_11f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_55.message_);
                                                  testing::Message::~Message(&local_11f0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_11e0);
                                                local_120c = 0xd0;
                                                local_1218 = proto2_unittest::TestAllTypesLite::
                                                             repeated_fixed64((TestAllTypesLite *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_long,_nullptr>
                                                          ((EqHelper *)local_1208,"208",
                                                           "message.repeated_fixed64(0)",&local_120c
                                                           ,&local_1218);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1208);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1220);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1208)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_56.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x111,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_56.message_,
                                                             &local_1220);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_56.message_);
                                                  testing::Message::~Message(&local_1220);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1208);
                                                local_123c = 0xd1;
                                                local_1240 = proto2_unittest::TestAllTypesLite::
                                                             repeated_sfixed32((TestAllTypesLite *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1238,"209",
                                                           "message.repeated_sfixed32(0)",
                                                           &local_123c,&local_1240);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1238);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1248);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1238)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_57.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x112,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_57.message_,
                                                             &local_1248);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_57.message_);
                                                  testing::Message::~Message(&local_1248);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1238);
                                                local_1264 = 0xd2;
                                                local_1270 = proto2_unittest::TestAllTypesLite::
                                                             repeated_sfixed64((TestAllTypesLite *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_long,_nullptr>
                                                          ((EqHelper *)local_1260,"210",
                                                           "message.repeated_sfixed64(0)",
                                                           &local_1264,&local_1270);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1260);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1278);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1260)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_58.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x113,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_58.message_,
                                                             &local_1278);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_58.message_);
                                                  testing::Message::~Message(&local_1278);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1260);
                                                local_1294 = 0xd3;
                                                local_1298 = proto2_unittest::TestAllTypesLite::
                                                             repeated_float((TestAllTypesLite *)
                                                                            gtest_ar_.message_._M_t.
                                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_float,_nullptr>
                                                          ((EqHelper *)local_1290,"211",
                                                           "message.repeated_float(0)",&local_1294,
                                                           &local_1298);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1290);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_12a0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1290)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_59.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x114,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_59.message_,
                                                             &local_12a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_59.message_);
                                                  testing::Message::~Message(&local_12a0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1290);
                                                local_12bc = 0xd4;
                                                local_12c8 = proto2_unittest::TestAllTypesLite::
                                                             repeated_double((TestAllTypesLite *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<int,_double,_nullptr>
                                                          ((EqHelper *)local_12b8,"212",
                                                           "message.repeated_double(0)",&local_12bc,
                                                           &local_12c8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_12b8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_12d0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_12b8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_60.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x115,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_60.message_,
                                                             &local_12d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_60.message_);
                                                  testing::Message::~Message(&local_12d0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_12b8);
                                                local_12e9 = true;
                                                local_12ea = proto2_unittest::TestAllTypesLite::
                                                             repeated_bool((TestAllTypesLite *)
                                                                           gtest_ar_.message_._M_t.
                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<bool,_bool,_nullptr>
                                                          ((EqHelper *)local_12e8,"true",
                                                           "message.repeated_bool(0)",&local_12e9,
                                                           &local_12ea);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_12e8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_12f8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_12e8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_61.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x116,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_61.message_,
                                                             &local_12f8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_61.message_);
                                                  testing::Message::~Message(&local_12f8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_12e8);
                                                psVar8 = proto2_unittest::TestAllTypesLite::
                                                         repeated_string_abi_cxx11_
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                          ((EqHelper *)local_1310,"\"215\"",
                                                           "message.repeated_string(0)",
                                                           (char (*) [4])"215",psVar8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1310);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1318);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1310)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_62.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x117,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_62.message_,
                                                             &local_1318);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_62.message_);
                                                  testing::Message::~Message(&local_1318);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1310);
                                                psVar8 = proto2_unittest::TestAllTypesLite::
                                                         repeated_bytes_abi_cxx11_
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                          ((EqHelper *)local_1330,"\"216\"",
                                                           "message.repeated_bytes(0)",
                                                           (char (*) [4])"216",psVar8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1330);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1338);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1330)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_63.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x118,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_63.message_,
                                                             &local_1338);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_63.message_);
                                                  testing::Message::~Message(&local_1338);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1330);
                                                local_1354 = 0xd9;
                                                pTVar9 = proto2_unittest::TestAllTypesLite::
                                                         repeatedgroup((TestAllTypesLite *)
                                                                       gtest_ar_.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                local_1358 = proto2_unittest::
                                                             TestAllTypesLite_RepeatedGroup::a
                                                                       (pTVar9);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1350,"217",
                                                           "message.repeatedgroup(0).a()",
                                                           &local_1354,&local_1358);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1350);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1360);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1350)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_64.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x11a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_64.message_,
                                                             &local_1360);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_64.message_);
                                                  testing::Message::~Message(&local_1360);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1350);
                                                local_137c = 0xda;
                                                pTVar4 = proto2_unittest::TestAllTypesLite::
                                                         repeated_nested_message
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                local_1380 = proto2_unittest::
                                                             TestAllTypesLite_NestedMessage::bb
                                                                       (pTVar4);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1378,"218",
                                                           "message.repeated_nested_message(0).bb()"
                                                           ,&local_137c,&local_1380);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1378);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1388);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1378)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_65.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x11b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_65.message_,
                                                             &local_1388);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_65.message_);
                                                  testing::Message::~Message(&local_1388);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1378);
                                                local_13a8[1] = 0xdb;
                                                pvVar10 = (void *)0x0;
                                                pFVar5 = proto2_unittest::TestAllTypesLite::
                                                         repeated_foreign_message
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                local_13a8[0] =
                                                     proto2_unittest::ForeignMessageLite::c
                                                               (pFVar5,pvVar10,extraout_RDX_00);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_13a0,"219",
                                                           "message.repeated_foreign_message(0).c()"
                                                           ,local_13a8 + 1,local_13a8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_13a0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_13b0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_13a0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_66.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x11c,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_66.message_,
                                                             &local_13b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_66.message_);
                                                  testing::Message::~Message(&local_13b0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_13a0);
                                                local_13cc = 0xdc;
                                                pIVar6 = proto2_unittest::TestAllTypesLite::
                                                         repeated_import_message
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                local_13d0 = proto2_unittest_import::
                                                             ImportMessageLite::d(pIVar6);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_13c8,"220",
                                                           "message.repeated_import_message(0).d()",
                                                           &local_13cc,&local_13d0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_13c8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_13d8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_13c8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_67.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x11d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_67.message_,
                                                             &local_13d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_67.message_);
                                                  testing::Message::~Message(&local_13d8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_13c8);
                                                local_13f4 = 0xe3;
                                                pTVar4 = proto2_unittest::TestAllTypesLite::
                                                         repeated_lazy_message
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                local_13f8 = proto2_unittest::
                                                             TestAllTypesLite_NestedMessage::bb
                                                                       (pTVar4);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_13f0,"227",
                                                           "message.repeated_lazy_message(0).bb()",
                                                           &local_13f4,&local_13f8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_13f0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1400);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_13f0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_68.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x11e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_68.message_,
                                                             &local_1400);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_68.message_);
                                                  testing::Message::~Message(&local_1400);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_13f0);
                                                local_141c = proto2_unittest::TestAllTypesLite::
                                                             repeated_nested_enum
                                                                       ((TestAllTypesLite *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<proto2_unittest::TestAllTypesLite_NestedEnum,_proto2_unittest::TestAllTypesLite_NestedEnum,_nullptr>
                                                          ((EqHelper *)local_1418,
                                                           "unittest::TestAllTypesLite::BAR",
                                                           "message.repeated_nested_enum(0)",
                                                           &proto2_unittest::TestAllTypesLite::BAR,
                                                           &local_141c);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1418);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1428);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1418)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_69.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x121,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_69.message_,
                                                             &local_1428);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_69.message_);
                                                  testing::Message::~Message(&local_1428);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1418);
                                                local_1448[1] = 5;
                                                local_1448[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     repeated_foreign_enum
                                                               ((TestAllTypesLite *)
                                                                gtest_ar_.message_._M_t.
                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<proto2_unittest::ForeignEnumLite,_proto2_unittest::ForeignEnumLite,_nullptr>
                                                          ((EqHelper *)local_1440,
                                                           "unittest::FOREIGN_LITE_BAR",
                                                           "message.repeated_foreign_enum(0)",
                                                           local_1448 + 1,local_1448);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1440);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1450);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1440)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_70.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x122,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_70.message_,
                                                             &local_1450);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_70.message_);
                                                  testing::Message::~Message(&local_1450);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1440);
                                                local_1470[1] = 8;
                                                local_1470[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     repeated_import_enum
                                                               ((TestAllTypesLite *)
                                                                gtest_ar_.message_._M_t.
                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,0);
                                                testing::internal::EqHelper::
                                                Compare<proto2_unittest_import::ImportEnumLite,_proto2_unittest_import::ImportEnumLite,_nullptr>
                                                          ((EqHelper *)local_1468,
                                                           "unittest_import::IMPORT_LITE_BAR",
                                                           "message.repeated_import_enum(0)",
                                                           local_1470 + 1,local_1470);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1468);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1478);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1468)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_71.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x123,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_71.message_,
                                                             &local_1478);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_71.message_);
                                                  testing::Message::~Message(&local_1478);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1468);
                                                local_1494 = 0x12d;
                                                local_1498 = proto2_unittest::TestAllTypesLite::
                                                             repeated_int32((TestAllTypesLite *)
                                                                            gtest_ar_.message_._M_t.
                                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1490,"301",
                                                           "message.repeated_int32(1)",&local_1494,
                                                           &local_1498);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1490);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_14a0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1490)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_72.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x125,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_72.message_,
                                                             &local_14a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_72.message_);
                                                  testing::Message::~Message(&local_14a0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1490);
                                                local_14bc = 0x12e;
                                                local_14c8 = proto2_unittest::TestAllTypesLite::
                                                             repeated_int64((TestAllTypesLite *)
                                                                            gtest_ar_.message_._M_t.
                                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_long,_nullptr>
                                                          ((EqHelper *)local_14b8,"302",
                                                           "message.repeated_int64(1)",&local_14bc,
                                                           &local_14c8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_14b8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_14d0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_14b8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_73.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x126,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_73.message_,
                                                             &local_14d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_73.message_);
                                                  testing::Message::~Message(&local_14d0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_14b8);
                                                local_14f0[1] = 0x12f;
                                                local_14f0[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     repeated_uint32((TestAllTypesLite *)
                                                                     gtest_ar_.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_int,_nullptr>
                                                          ((EqHelper *)local_14e8,"303",
                                                           "message.repeated_uint32(1)",
                                                           (int *)(local_14f0 + 1),local_14f0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_14e8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_14f8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_14e8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_74.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x127,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_74.message_,
                                                             &local_14f8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_74.message_);
                                                  testing::Message::~Message(&local_14f8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_14e8);
                                                local_1514 = 0x130;
                                                local_1520 = proto2_unittest::TestAllTypesLite::
                                                             repeated_uint64((TestAllTypesLite *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_long,_nullptr>
                                                          ((EqHelper *)local_1510,"304",
                                                           "message.repeated_uint64(1)",&local_1514,
                                                           &local_1520);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1510);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1528);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1510)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_75.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x128,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_75.message_,
                                                             &local_1528);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_75.message_);
                                                  testing::Message::~Message(&local_1528);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1510);
                                                local_1544 = 0x131;
                                                local_1548 = proto2_unittest::TestAllTypesLite::
                                                             repeated_sint32((TestAllTypesLite *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1540,"305",
                                                           "message.repeated_sint32(1)",&local_1544,
                                                           &local_1548);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1540);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1550);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1540)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_76.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x129,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_76.message_,
                                                             &local_1550);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_76.message_);
                                                  testing::Message::~Message(&local_1550);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1540);
                                                local_156c = 0x132;
                                                local_1578 = proto2_unittest::TestAllTypesLite::
                                                             repeated_sint64((TestAllTypesLite *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_long,_nullptr>
                                                          ((EqHelper *)local_1568,"306",
                                                           "message.repeated_sint64(1)",&local_156c,
                                                           &local_1578);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1568);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1580);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1568)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_77.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x12a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_77.message_,
                                                             &local_1580);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_77.message_);
                                                  testing::Message::~Message(&local_1580);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1568);
                                                local_15a0[1] = 0x133;
                                                local_15a0[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     repeated_fixed32((TestAllTypesLite *)
                                                                      gtest_ar_.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_int,_nullptr>
                                                          ((EqHelper *)local_1598,"307",
                                                           "message.repeated_fixed32(1)",
                                                           (int *)(local_15a0 + 1),local_15a0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1598);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_15a8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1598)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_78.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,299,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_78.message_,
                                                             &local_15a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_78.message_);
                                                  testing::Message::~Message(&local_15a8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1598);
                                                local_15c4 = 0x134;
                                                local_15d0 = proto2_unittest::TestAllTypesLite::
                                                             repeated_fixed64((TestAllTypesLite *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_long,_nullptr>
                                                          ((EqHelper *)local_15c0,"308",
                                                           "message.repeated_fixed64(1)",&local_15c4
                                                           ,&local_15d0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_15c0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_15d8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_15c0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_79.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,300,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_79.message_,
                                                             &local_15d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_79.message_);
                                                  testing::Message::~Message(&local_15d8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_15c0);
                                                local_15f4 = 0x135;
                                                local_15f8 = proto2_unittest::TestAllTypesLite::
                                                             repeated_sfixed32((TestAllTypesLite *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_15f0,"309",
                                                           "message.repeated_sfixed32(1)",
                                                           &local_15f4,&local_15f8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_15f0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1600);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_15f0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_80.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x12d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_80.message_,
                                                             &local_1600);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_80.message_);
                                                  testing::Message::~Message(&local_1600);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_15f0);
                                                local_161c = 0x136;
                                                local_1628 = proto2_unittest::TestAllTypesLite::
                                                             repeated_sfixed64((TestAllTypesLite *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_long,_nullptr>
                                                          ((EqHelper *)local_1618,"310",
                                                           "message.repeated_sfixed64(1)",
                                                           &local_161c,&local_1628);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1618);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1630);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1618)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_81.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x12e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_81.message_,
                                                             &local_1630);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_81.message_);
                                                  testing::Message::~Message(&local_1630);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1618);
                                                local_164c = 0x137;
                                                local_1650 = proto2_unittest::TestAllTypesLite::
                                                             repeated_float((TestAllTypesLite *)
                                                                            gtest_ar_.message_._M_t.
                                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_float,_nullptr>
                                                          ((EqHelper *)local_1648,"311",
                                                           "message.repeated_float(1)",&local_164c,
                                                           &local_1650);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1648);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1658);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1648)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_82.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x12f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_82.message_,
                                                             &local_1658);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_82.message_);
                                                  testing::Message::~Message(&local_1658);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1648);
                                                local_1674 = 0x138;
                                                local_1680 = proto2_unittest::TestAllTypesLite::
                                                             repeated_double((TestAllTypesLite *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<int,_double,_nullptr>
                                                          ((EqHelper *)local_1670,"312",
                                                           "message.repeated_double(1)",&local_1674,
                                                           &local_1680);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1670);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1688);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1670)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar__32.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x130,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__32.message_,
                                                             &local_1688);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__32.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1688);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1670);
                                                local_16a1 = proto2_unittest::TestAllTypesLite::
                                                             repeated_bool((TestAllTypesLite *)
                                                                           gtest_ar_.message_._M_t.
                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                local_16a1 = !local_16a1;
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_16a0,&local_16a1
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_16a0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_16b0);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar_83.message_,
                                                             (internal *)local_16a0,
                                                             (AssertionResult *)
                                                             "message.repeated_bool(1)","true",
                                                             "false",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_16b8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x133,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_16b8,&local_16b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_16b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_83.message_);
                                                  testing::Message::~Message(&local_16b0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_16a0);
                                                psVar8 = proto2_unittest::TestAllTypesLite::
                                                         repeated_string_abi_cxx11_
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                          ((EqHelper *)local_16e8,"\"315\"",
                                                           "message.repeated_string(1)",
                                                           (char (*) [4])"315",psVar8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_16e8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_16f0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_16e8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_84.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x134,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_84.message_,
                                                             &local_16f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_84.message_);
                                                  testing::Message::~Message(&local_16f0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_16e8);
                                                psVar8 = proto2_unittest::TestAllTypesLite::
                                                         repeated_bytes_abi_cxx11_
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                          ((EqHelper *)local_1708,"\"316\"",
                                                           "message.repeated_bytes(1)",
                                                           (char (*) [4])"316",psVar8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1708);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1710);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1708)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_85.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x135,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_85.message_,
                                                             &local_1710);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_85.message_);
                                                  testing::Message::~Message(&local_1710);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1708);
                                                local_172c = 0x13d;
                                                pTVar9 = proto2_unittest::TestAllTypesLite::
                                                         repeatedgroup((TestAllTypesLite *)
                                                                       gtest_ar_.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                local_1730 = proto2_unittest::
                                                             TestAllTypesLite_RepeatedGroup::a
                                                                       (pTVar9);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1728,"317",
                                                           "message.repeatedgroup(1).a()",
                                                           &local_172c,&local_1730);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1728);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1738);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1728)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_86.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x137,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_86.message_,
                                                             &local_1738);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_86.message_);
                                                  testing::Message::~Message(&local_1738);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1728);
                                                local_1754 = 0x13e;
                                                pTVar4 = proto2_unittest::TestAllTypesLite::
                                                         repeated_nested_message
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                local_1758 = proto2_unittest::
                                                             TestAllTypesLite_NestedMessage::bb
                                                                       (pTVar4);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1750,"318",
                                                           "message.repeated_nested_message(1).bb()"
                                                           ,&local_1754,&local_1758);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1750);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1760);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1750)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_87.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x138,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_87.message_,
                                                             &local_1760);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_87.message_);
                                                  testing::Message::~Message(&local_1760);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1750);
                                                local_1780[1] = 0x13f;
                                                pvVar10 = (void *)0x1;
                                                pFVar5 = proto2_unittest::TestAllTypesLite::
                                                         repeated_foreign_message
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                local_1780[0] =
                                                     proto2_unittest::ForeignMessageLite::c
                                                               (pFVar5,pvVar10,extraout_RDX_01);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1778,"319",
                                                           "message.repeated_foreign_message(1).c()"
                                                           ,local_1780 + 1,local_1780);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1778);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1788);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1778)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_88.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x139,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_88.message_,
                                                             &local_1788);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_88.message_);
                                                  testing::Message::~Message(&local_1788);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1778);
                                                local_17a4 = 0x140;
                                                pIVar6 = proto2_unittest::TestAllTypesLite::
                                                         repeated_import_message
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                local_17a8 = proto2_unittest_import::
                                                             ImportMessageLite::d(pIVar6);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_17a0,"320",
                                                           "message.repeated_import_message(1).d()",
                                                           &local_17a4,&local_17a8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_17a0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_17b0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_17a0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_89.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x13a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_89.message_,
                                                             &local_17b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_89.message_);
                                                  testing::Message::~Message(&local_17b0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_17a0);
                                                local_17cc = 0x147;
                                                pTVar4 = proto2_unittest::TestAllTypesLite::
                                                         repeated_lazy_message
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                local_17d0 = proto2_unittest::
                                                             TestAllTypesLite_NestedMessage::bb
                                                                       (pTVar4);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_17c8,"327",
                                                           "message.repeated_lazy_message(1).bb()",
                                                           &local_17cc,&local_17d0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_17c8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_17d8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_17c8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_90.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x13b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_90.message_,
                                                             &local_17d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_90.message_);
                                                  testing::Message::~Message(&local_17d8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_17c8);
                                                local_17f4 = proto2_unittest::TestAllTypesLite::
                                                             repeated_nested_enum
                                                                       ((TestAllTypesLite *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<proto2_unittest::TestAllTypesLite_NestedEnum,_proto2_unittest::TestAllTypesLite_NestedEnum,_nullptr>
                                                          ((EqHelper *)local_17f0,
                                                           "unittest::TestAllTypesLite::BAZ",
                                                           "message.repeated_nested_enum(1)",
                                                           &proto2_unittest::TestAllTypesLite::BAZ,
                                                           &local_17f4);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_17f0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1800);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_17f0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_91.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x13d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_91.message_,
                                                             &local_1800);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_91.message_);
                                                  testing::Message::~Message(&local_1800);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_17f0);
                                                local_1820[1] = 6;
                                                local_1820[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     repeated_foreign_enum
                                                               ((TestAllTypesLite *)
                                                                gtest_ar_.message_._M_t.
                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<proto2_unittest::ForeignEnumLite,_proto2_unittest::ForeignEnumLite,_nullptr>
                                                          ((EqHelper *)local_1818,
                                                           "unittest::FOREIGN_LITE_BAZ",
                                                           "message.repeated_foreign_enum(1)",
                                                           local_1820 + 1,local_1820);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1818);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1828);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1818)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_92.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x13e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_92.message_,
                                                             &local_1828);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_92.message_);
                                                  testing::Message::~Message(&local_1828);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1818);
                                                local_1848[1] = 9;
                                                local_1848[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     repeated_import_enum
                                                               ((TestAllTypesLite *)
                                                                gtest_ar_.message_._M_t.
                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,1);
                                                testing::internal::EqHelper::
                                                Compare<proto2_unittest_import::ImportEnumLite,_proto2_unittest_import::ImportEnumLite,_nullptr>
                                                          ((EqHelper *)local_1840,
                                                           "unittest_import::IMPORT_LITE_BAZ",
                                                           "message.repeated_import_enum(1)",
                                                           local_1848 + 1,local_1848);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1840);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1850);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1840)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar__33.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x13f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__33.message_,
                                                             &local_1850);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__33.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1850);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1840);
                                                local_1869 = proto2_unittest::TestAllTypesLite::
                                                             has_default_int32((TestAllTypesLite *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1868,&local_1869
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1868);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1878);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__34.message_,
                                                             (internal *)local_1868,
                                                             (AssertionResult *)
                                                             "message.has_default_int32()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1880,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x144,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1880,&local_1878);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1880);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__34.message_);
                                                  testing::Message::~Message(&local_1878);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1868);
                                                local_18b1 = proto2_unittest::TestAllTypesLite::
                                                             has_default_int64((TestAllTypesLite *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_18b0,&local_18b1
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_18b0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_18c0);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__35.message_,
                                                             (internal *)local_18b0,
                                                             (AssertionResult *)
                                                             "message.has_default_int64()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_18c8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x145,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_18c8,&local_18c0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_18c8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__35.message_);
                                                  testing::Message::~Message(&local_18c0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_18b0);
                                                local_18f9 = proto2_unittest::TestAllTypesLite::
                                                             has_default_uint32((TestAllTypesLite *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_18f8,&local_18f9
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_18f8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1908);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__36.message_,
                                                             (internal *)local_18f8,
                                                             (AssertionResult *)
                                                             "message.has_default_uint32()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1910,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x146,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1910,&local_1908);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1910);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__36.message_);
                                                  testing::Message::~Message(&local_1908);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_18f8);
                                                local_1941 = proto2_unittest::TestAllTypesLite::
                                                             has_default_uint64((TestAllTypesLite *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1940,&local_1941
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1940);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1950);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__37.message_,
                                                             (internal *)local_1940,
                                                             (AssertionResult *)
                                                             "message.has_default_uint64()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1958,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x147,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1958,&local_1950);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1958);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__37.message_);
                                                  testing::Message::~Message(&local_1950);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1940);
                                                local_1989 = proto2_unittest::TestAllTypesLite::
                                                             has_default_sint32((TestAllTypesLite *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1988,&local_1989
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1988);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1998);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__38.message_,
                                                             (internal *)local_1988,
                                                             (AssertionResult *)
                                                             "message.has_default_sint32()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_19a0,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x148,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_19a0,&local_1998);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_19a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__38.message_);
                                                  testing::Message::~Message(&local_1998);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1988);
                                                local_19d1 = proto2_unittest::TestAllTypesLite::
                                                             has_default_sint64((TestAllTypesLite *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_19d0,&local_19d1
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_19d0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_19e0);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__39.message_,
                                                             (internal *)local_19d0,
                                                             (AssertionResult *)
                                                             "message.has_default_sint64()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_19e8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x149,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_19e8,&local_19e0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_19e8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__39.message_);
                                                  testing::Message::~Message(&local_19e0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_19d0);
                                                local_1a19 = proto2_unittest::TestAllTypesLite::
                                                             has_default_fixed32((TestAllTypesLite *
                                                                                 )gtest_ar_.message_
                                                                                  ._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1a18,&local_1a19
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1a18);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1a28);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__40.message_,
                                                             (internal *)local_1a18,
                                                             (AssertionResult *)
                                                             "message.has_default_fixed32()","false"
                                                             ,"true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1a30,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1a30,&local_1a28);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1a30);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__40.message_);
                                                  testing::Message::~Message(&local_1a28);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1a18);
                                                local_1a61 = proto2_unittest::TestAllTypesLite::
                                                             has_default_fixed64((TestAllTypesLite *
                                                                                 )gtest_ar_.message_
                                                                                  ._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1a60,&local_1a61
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1a60);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1a70);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__41.message_,
                                                             (internal *)local_1a60,
                                                             (AssertionResult *)
                                                             "message.has_default_fixed64()","false"
                                                             ,"true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1a78,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1a78,&local_1a70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1a78);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__41.message_);
                                                  testing::Message::~Message(&local_1a70);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1a60);
                                                local_1aa9 = proto2_unittest::TestAllTypesLite::
                                                             has_default_sfixed32
                                                                       ((TestAllTypesLite *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1aa8,&local_1aa9
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1aa8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1ab8);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__42.message_,
                                                             (internal *)local_1aa8,
                                                             (AssertionResult *)
                                                             "message.has_default_sfixed32()",
                                                             "false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1ac0,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14c,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1ac0,&local_1ab8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1ac0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__42.message_);
                                                  testing::Message::~Message(&local_1ab8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1aa8);
                                                local_1af1 = proto2_unittest::TestAllTypesLite::
                                                             has_default_sfixed64
                                                                       ((TestAllTypesLite *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1af0,&local_1af1
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1af0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1b00);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__43.message_,
                                                             (internal *)local_1af0,
                                                             (AssertionResult *)
                                                             "message.has_default_sfixed64()",
                                                             "false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1b08,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1b08,&local_1b00);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1b08);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__43.message_);
                                                  testing::Message::~Message(&local_1b00);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1af0);
                                                local_1b39 = proto2_unittest::TestAllTypesLite::
                                                             has_default_float((TestAllTypesLite *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1b38,&local_1b39
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1b38);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1b48);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__44.message_,
                                                             (internal *)local_1b38,
                                                             (AssertionResult *)
                                                             "message.has_default_float()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1b50,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1b50,&local_1b48);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1b50);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__44.message_);
                                                  testing::Message::~Message(&local_1b48);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1b38);
                                                local_1b81 = proto2_unittest::TestAllTypesLite::
                                                             has_default_double((TestAllTypesLite *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1b80,&local_1b81
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1b80);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1b90);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__45.message_,
                                                             (internal *)local_1b80,
                                                             (AssertionResult *)
                                                             "message.has_default_double()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1b98,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x14f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1b98,&local_1b90);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1b98);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__45.message_);
                                                  testing::Message::~Message(&local_1b90);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1b80);
                                                local_1bc9 = proto2_unittest::TestAllTypesLite::
                                                             has_default_bool((TestAllTypesLite *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1bc8,&local_1bc9
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1bc8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1bd8);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__46.message_,
                                                             (internal *)local_1bc8,
                                                             (AssertionResult *)
                                                             "message.has_default_bool()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1be0,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x150,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1be0,&local_1bd8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1be0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__46.message_);
                                                  testing::Message::~Message(&local_1bd8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1bc8);
                                                local_1c11 = proto2_unittest::TestAllTypesLite::
                                                             has_default_string((TestAllTypesLite *)
                                                                                gtest_ar_.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1c10,&local_1c11
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1c10);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1c20);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__47.message_,
                                                             (internal *)local_1c10,
                                                             (AssertionResult *)
                                                             "message.has_default_string()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1c28,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x151,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1c28,&local_1c20);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1c28);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__47.message_);
                                                  testing::Message::~Message(&local_1c20);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1c10);
                                                local_1c59 = proto2_unittest::TestAllTypesLite::
                                                             has_default_bytes((TestAllTypesLite *)
                                                                               gtest_ar_.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1c58,&local_1c59
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1c58);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1c68);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__48.message_,
                                                             (internal *)local_1c58,
                                                             (AssertionResult *)
                                                             "message.has_default_bytes()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1c70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x152,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1c70,&local_1c68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1c70);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__48.message_);
                                                  testing::Message::~Message(&local_1c68);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1c58);
                                                local_1ca1 = proto2_unittest::TestAllTypesLite::
                                                             has_default_nested_enum
                                                                       ((TestAllTypesLite *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1ca0,&local_1ca1
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1ca0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1cb0);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__49.message_,
                                                             (internal *)local_1ca0,
                                                             (AssertionResult *)
                                                             "message.has_default_nested_enum()",
                                                             "false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1cb8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x154,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1cb8,&local_1cb0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1cb8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__49.message_);
                                                  testing::Message::~Message(&local_1cb0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1ca0);
                                                local_1ce9 = proto2_unittest::TestAllTypesLite::
                                                             has_default_foreign_enum
                                                                       ((TestAllTypesLite *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1ce8,&local_1ce9
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1ce8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1cf8);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__50.message_,
                                                             (internal *)local_1ce8,
                                                             (AssertionResult *)
                                                             "message.has_default_foreign_enum()",
                                                             "false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1d00,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x155,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1d00,&local_1cf8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1d00);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__50.message_);
                                                  testing::Message::~Message(&local_1cf8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1ce8);
                                                local_1d31 = proto2_unittest::TestAllTypesLite::
                                                             has_default_import_enum
                                                                       ((TestAllTypesLite *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1d30,&local_1d31
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1d30);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1d40);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar_93.message_,
                                                             (internal *)local_1d30,
                                                             (AssertionResult *)
                                                             "message.has_default_import_enum()",
                                                             "false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1d48,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x156,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1d48,&local_1d40);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1d48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_93.message_);
                                                  testing::Message::~Message(&local_1d40);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1d30);
                                                local_1d7c = 0x191;
                                                local_1d80 = proto2_unittest::TestAllTypesLite::
                                                             default_int32((TestAllTypesLite *)
                                                                           gtest_ar_.message_._M_t.
                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1d78,"401",
                                                           "message.default_int32()",&local_1d7c,
                                                           &local_1d80);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1d78);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1d88);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1d78)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_94.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x159,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_94.message_,
                                                             &local_1d88);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_94.message_);
                                                  testing::Message::~Message(&local_1d88);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1d78);
                                                local_1da4 = 0x192;
                                                local_1db0 = proto2_unittest::TestAllTypesLite::
                                                             default_int64((TestAllTypesLite *)
                                                                           gtest_ar_.message_._M_t.
                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_long,_nullptr>
                                                          ((EqHelper *)local_1da0,"402",
                                                           "message.default_int64()",&local_1da4,
                                                           &local_1db0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1da0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1db8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1da0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_95.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_95.message_,
                                                             &local_1db8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_95.message_);
                                                  testing::Message::~Message(&local_1db8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1da0);
                                                local_1dd8[1] = 0x193;
                                                local_1dd8[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     default_uint32((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_int,_nullptr>
                                                          ((EqHelper *)local_1dd0,"403",
                                                           "message.default_uint32()",
                                                           (int *)(local_1dd8 + 1),local_1dd8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1dd0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1de0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1dd0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_96.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_96.message_,
                                                             &local_1de0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_96.message_);
                                                  testing::Message::~Message(&local_1de0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1dd0);
                                                local_1dfc = 0x194;
                                                local_1e08 = proto2_unittest::TestAllTypesLite::
                                                             default_uint64((TestAllTypesLite *)
                                                                            gtest_ar_.message_._M_t.
                                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_long,_nullptr>
                                                          ((EqHelper *)local_1df8,"404",
                                                           "message.default_uint64()",&local_1dfc,
                                                           &local_1e08);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1df8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1e10);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1df8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_97.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15c,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_97.message_,
                                                             &local_1e10);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_97.message_);
                                                  testing::Message::~Message(&local_1e10);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1df8);
                                                local_1e2c = 0x195;
                                                local_1e30 = proto2_unittest::TestAllTypesLite::
                                                             default_sint32((TestAllTypesLite *)
                                                                            gtest_ar_.message_._M_t.
                                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1e28,"405",
                                                           "message.default_sint32()",&local_1e2c,
                                                           &local_1e30);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1e28);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1e38);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1e28)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_98.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_98.message_,
                                                             &local_1e38);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_98.message_);
                                                  testing::Message::~Message(&local_1e38);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1e28);
                                                local_1e54 = 0x196;
                                                local_1e60 = proto2_unittest::TestAllTypesLite::
                                                             default_sint64((TestAllTypesLite *)
                                                                            gtest_ar_.message_._M_t.
                                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_long,_nullptr>
                                                          ((EqHelper *)local_1e50,"406",
                                                           "message.default_sint64()",&local_1e54,
                                                           &local_1e60);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1e50);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1e68);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1e50)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_99.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_99.message_,
                                                             &local_1e68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_99.message_);
                                                  testing::Message::~Message(&local_1e68);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1e50);
                                                local_1e88[1] = 0x197;
                                                local_1e88[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     default_fixed32((TestAllTypesLite *)
                                                                     gtest_ar_.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_int,_nullptr>
                                                          ((EqHelper *)local_1e80,"407",
                                                           "message.default_fixed32()",
                                                           (int *)(local_1e88 + 1),local_1e88);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1e80);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1e90);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1e80)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_100.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x15f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_100.message_,
                                                             &local_1e90);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_100.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1e90);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1e80);
                                                local_1eac = 0x198;
                                                local_1eb8 = proto2_unittest::TestAllTypesLite::
                                                             default_fixed64((TestAllTypesLite *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_unsigned_long,_nullptr>
                                                          ((EqHelper *)local_1ea8,"408",
                                                           "message.default_fixed64()",&local_1eac,
                                                           &local_1eb8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1ea8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1ec0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1ea8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_101.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x160,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_101.message_,
                                                             &local_1ec0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_101.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1ec0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1ea8);
                                                local_1edc = 0x199;
                                                local_1ee0 = proto2_unittest::TestAllTypesLite::
                                                             default_sfixed32((TestAllTypesLite *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_1ed8,"409",
                                                           "message.default_sfixed32()",&local_1edc,
                                                           &local_1ee0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1ed8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1ee8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1ed8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_102.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x161,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_102.message_,
                                                             &local_1ee8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_102.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1ee8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1ed8);
                                                local_1f04 = 0x19a;
                                                local_1f10 = proto2_unittest::TestAllTypesLite::
                                                             default_sfixed64((TestAllTypesLite *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_long,_nullptr>
                                                          ((EqHelper *)local_1f00,"410",
                                                           "message.default_sfixed64()",&local_1f04,
                                                           &local_1f10);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1f00);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1f18);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1f00)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_103.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x162,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_103.message_,
                                                             &local_1f18);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_103.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1f18);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1f00);
                                                local_1f34 = 0x19b;
                                                local_1f38 = proto2_unittest::TestAllTypesLite::
                                                             default_float((TestAllTypesLite *)
                                                                           gtest_ar_.message_._M_t.
                                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_float,_nullptr>
                                                          ((EqHelper *)local_1f30,"411",
                                                           "message.default_float()",&local_1f34,
                                                           &local_1f38);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1f30);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1f40);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1f30)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_104.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x163,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_104.message_,
                                                             &local_1f40);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_104.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1f40);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1f30);
                                                local_1f5c = 0x19c;
                                                local_1f68 = proto2_unittest::TestAllTypesLite::
                                                             default_double((TestAllTypesLite *)
                                                                            gtest_ar_.message_._M_t.
                                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<int,_double,_nullptr>
                                                          ((EqHelper *)local_1f58,"412",
                                                           "message.default_double()",&local_1f5c,
                                                           &local_1f68);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1f58);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1f70);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1f58)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar__51.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x164,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__51.message_,
                                                             &local_1f70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__51.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1f70);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1f58);
                                                local_1f89 = proto2_unittest::TestAllTypesLite::
                                                             default_bool((TestAllTypesLite *)
                                                                          gtest_ar_.message_._M_t.
                                                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                local_1f89 = !local_1f89;
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_1f88,&local_1f89
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1f88);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1f98);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar_105.message_,
                                                             (internal *)local_1f88,
                                                             (AssertionResult *)
                                                             "message.default_bool()","true","false"
                                                             ,in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1fa0,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x165,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1fa0,&local_1f98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1fa0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_105.message_);
                                                  testing::Message::~Message(&local_1f98);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1f88);
                                                psVar8 = proto2_unittest::TestAllTypesLite::
                                                         default_string_abi_cxx11_
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                          ((EqHelper *)local_1fd0,"\"415\"",
                                                           "message.default_string()",
                                                           (char (*) [4])"415",psVar8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1fd0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1fd8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1fd0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_106.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x166,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_106.message_,
                                                             &local_1fd8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_106.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1fd8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1fd0);
                                                psVar8 = proto2_unittest::TestAllTypesLite::
                                                         default_bytes_abi_cxx11_
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                          ((EqHelper *)local_1ff0,"\"416\"",
                                                           "message.default_bytes()",
                                                           (char (*) [4])"416",psVar8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_1ff0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_1ff8);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_1ff0)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_107.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x167,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_107.message_,
                                                             &local_1ff8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_107.message_)
                                                  ;
                                                  testing::Message::~Message(&local_1ff8);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_1ff0);
                                                local_2014 = proto2_unittest::TestAllTypesLite::
                                                             default_nested_enum((TestAllTypesLite *
                                                                                 )gtest_ar_.message_
                                                                                  ._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<proto2_unittest::TestAllTypesLite_NestedEnum,_proto2_unittest::TestAllTypesLite_NestedEnum,_nullptr>
                                                          ((EqHelper *)local_2010,
                                                           "unittest::TestAllTypesLite::FOO",
                                                           "message.default_nested_enum()",
                                                           &proto2_unittest::TestAllTypesLite::FOO,
                                                           &local_2014);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_2010);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_2020);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_2010)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_108.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x169,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_108.message_,
                                                             &local_2020);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_108.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2020);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_2010);
                                                local_2040[1] = 4;
                                                local_2040[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     default_foreign_enum
                                                               ((TestAllTypesLite *)
                                                                gtest_ar_.message_._M_t.
                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<proto2_unittest::ForeignEnumLite,_proto2_unittest::ForeignEnumLite,_nullptr>
                                                          ((EqHelper *)local_2038,
                                                           "unittest::FOREIGN_LITE_FOO",
                                                           "message.default_foreign_enum()",
                                                           local_2040 + 1,local_2040);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_2038);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_2048);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_2038)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_109.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x16a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_109.message_,
                                                             &local_2048);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_109.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2048);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_2038);
                                                local_2068[1] = 7;
                                                local_2068[0] =
                                                     proto2_unittest::TestAllTypesLite::
                                                     default_import_enum((TestAllTypesLite *)
                                                                         gtest_ar_.message_._M_t.
                                                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<proto2_unittest_import::ImportEnumLite,_proto2_unittest_import::ImportEnumLite,_nullptr>
                                                          ((EqHelper *)local_2060,
                                                           "unittest_import::IMPORT_LITE_FOO",
                                                           "message.default_import_enum()",
                                                           local_2068 + 1,local_2068);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_2060);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_2070);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_2060)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar__52.message_,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x16b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__52.message_,
                                                             &local_2070);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__52.message_)
                                                  ;
                                                  testing::Message::~Message(&local_2070);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_2060);
                                                local_2089 = proto2_unittest::TestAllTypesLite::
                                                             has_oneof_uint32((TestAllTypesLite *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                local_2089 = !local_2089;
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_2088,&local_2089
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_2088);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_2098);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__53.message_,
                                                             (internal *)local_2088,
                                                             (AssertionResult *)
                                                             "message.has_oneof_uint32()","true",
                                                             "false",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_20a0,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x16e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_20a0,&local_2098);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_20a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__53.message_);
                                                  testing::Message::~Message(&local_2098);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_2088);
                                                local_20d1 = proto2_unittest::TestAllTypesLite::
                                                             has_oneof_nested_message
                                                                       ((TestAllTypesLite *)
                                                                        gtest_ar_.message_._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                local_20d1 = !local_20d1;
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_20d0,&local_20d1
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_20d0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_20e0);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__54.message_,
                                                             (internal *)local_20d0,
                                                             (AssertionResult *)
                                                             "message.has_oneof_nested_message()",
                                                             "true","false",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_20e8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x16f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_20e8,&local_20e0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_20e8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__54.message_);
                                                  testing::Message::~Message(&local_20e0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_20d0);
                                                local_2119 = proto2_unittest::TestAllTypesLite::
                                                             has_oneof_string((TestAllTypesLite *)
                                                                              gtest_ar_.message_.
                                                                              _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                local_2119 = !local_2119;
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_2118,&local_2119
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_2118);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_2128);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__55.message_,
                                                             (internal *)local_2118,
                                                             (AssertionResult *)
                                                             "message.has_oneof_string()","true",
                                                             "false",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_2130,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x170,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_2130,&local_2128);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_2130);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__55.message_);
                                                  testing::Message::~Message(&local_2128);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_2118);
                                                local_2161 = proto2_unittest::TestAllTypesLite::
                                                             has_oneof_bytes((TestAllTypesLite *)
                                                                             gtest_ar_.message_._M_t
                                                                             .
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_2160,&local_2161
                                                           ,(type *)0x0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_2160);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_2170);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar_110.message_,
                                                             (internal *)local_2160,
                                                             (AssertionResult *)
                                                             "message.has_oneof_bytes()","false",
                                                             "true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_2178,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x171,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_2178,&local_2170);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_2178);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_110.message_);
                                                  testing::Message::~Message(&local_2170);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_2160);
                                                psVar8 = proto2_unittest::TestAllTypesLite::
                                                         oneof_bytes_abi_cxx11_
                                                                   ((TestAllTypesLite *)
                                                                    gtest_ar_.message_._M_t.
                                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                testing::internal::EqHelper::
                                                Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                          ((EqHelper *)local_21a8,"\"604\"",
                                                           "message.oneof_bytes()",
                                                           (char (*) [4])"604",psVar8);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_21a8);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_21b0);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_21a8)
                                                  ;
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_21b8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util_lite.cc"
                                                  ,0x173,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_21b8,&local_21b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_21b8);
                                                  testing::Message::~Message(&local_21b0);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_21a8);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TestUtilLite::ExpectAllFieldsSet(
    const unittest::TestAllTypesLite& message) {
  EXPECT_TRUE(message.has_optional_int32());
  EXPECT_TRUE(message.has_optional_int64());
  EXPECT_TRUE(message.has_optional_uint32());
  EXPECT_TRUE(message.has_optional_uint64());
  EXPECT_TRUE(message.has_optional_sint32());
  EXPECT_TRUE(message.has_optional_sint64());
  EXPECT_TRUE(message.has_optional_fixed32());
  EXPECT_TRUE(message.has_optional_fixed64());
  EXPECT_TRUE(message.has_optional_sfixed32());
  EXPECT_TRUE(message.has_optional_sfixed64());
  EXPECT_TRUE(message.has_optional_float());
  EXPECT_TRUE(message.has_optional_double());
  EXPECT_TRUE(message.has_optional_bool());
  EXPECT_TRUE(message.has_optional_string());
  EXPECT_TRUE(message.has_optional_bytes());

  EXPECT_TRUE(message.has_optionalgroup());
  EXPECT_TRUE(message.has_optional_nested_message());
  EXPECT_TRUE(message.has_optional_foreign_message());
  EXPECT_TRUE(message.has_optional_import_message());
  EXPECT_TRUE(message.has_optional_public_import_message());
  EXPECT_TRUE(message.has_optional_lazy_message());
  EXPECT_TRUE(message.has_optional_unverified_lazy_message());

  EXPECT_TRUE(message.optionalgroup().has_a());
  EXPECT_TRUE(message.optional_nested_message().has_bb());
  EXPECT_TRUE(message.optional_foreign_message().has_c());
  EXPECT_TRUE(message.optional_import_message().has_d());
  EXPECT_TRUE(message.optional_public_import_message().has_e());
  EXPECT_TRUE(message.optional_lazy_message().has_bb());
  EXPECT_TRUE(message.optional_unverified_lazy_message().has_bb());

  EXPECT_TRUE(message.has_optional_nested_enum());
  EXPECT_TRUE(message.has_optional_foreign_enum());
  EXPECT_TRUE(message.has_optional_import_enum());


  EXPECT_EQ(101, message.optional_int32());
  EXPECT_EQ(102, message.optional_int64());
  EXPECT_EQ(103, message.optional_uint32());
  EXPECT_EQ(104, message.optional_uint64());
  EXPECT_EQ(105, message.optional_sint32());
  EXPECT_EQ(106, message.optional_sint64());
  EXPECT_EQ(107, message.optional_fixed32());
  EXPECT_EQ(108, message.optional_fixed64());
  EXPECT_EQ(109, message.optional_sfixed32());
  EXPECT_EQ(110, message.optional_sfixed64());
  EXPECT_EQ(111, message.optional_float());
  EXPECT_EQ(112, message.optional_double());
  EXPECT_EQ(true, message.optional_bool());
  EXPECT_EQ("115", message.optional_string());
  EXPECT_EQ("116", message.optional_bytes());

  EXPECT_EQ(117, message.optionalgroup().a());
  EXPECT_EQ(118, message.optional_nested_message().bb());
  EXPECT_EQ(119, message.optional_foreign_message().c());
  EXPECT_EQ(120, message.optional_import_message().d());
  EXPECT_EQ(126, message.optional_public_import_message().e());
  EXPECT_EQ(127, message.optional_lazy_message().bb());
  EXPECT_EQ(128, message.optional_unverified_lazy_message().bb());

  EXPECT_EQ(unittest::TestAllTypesLite::BAZ, message.optional_nested_enum());
  EXPECT_EQ(unittest::FOREIGN_LITE_BAZ, message.optional_foreign_enum());
  EXPECT_EQ(unittest_import::IMPORT_LITE_BAZ, message.optional_import_enum());


  // -----------------------------------------------------------------

  ASSERT_EQ(2, message.repeated_int32_size());
  ASSERT_EQ(2, message.repeated_int64_size());
  ASSERT_EQ(2, message.repeated_uint32_size());
  ASSERT_EQ(2, message.repeated_uint64_size());
  ASSERT_EQ(2, message.repeated_sint32_size());
  ASSERT_EQ(2, message.repeated_sint64_size());
  ASSERT_EQ(2, message.repeated_fixed32_size());
  ASSERT_EQ(2, message.repeated_fixed64_size());
  ASSERT_EQ(2, message.repeated_sfixed32_size());
  ASSERT_EQ(2, message.repeated_sfixed64_size());
  ASSERT_EQ(2, message.repeated_float_size());
  ASSERT_EQ(2, message.repeated_double_size());
  ASSERT_EQ(2, message.repeated_bool_size());
  ASSERT_EQ(2, message.repeated_string_size());
  ASSERT_EQ(2, message.repeated_bytes_size());

  ASSERT_EQ(2, message.repeatedgroup_size());
  ASSERT_EQ(2, message.repeated_nested_message_size());
  ASSERT_EQ(2, message.repeated_foreign_message_size());
  ASSERT_EQ(2, message.repeated_import_message_size());
  ASSERT_EQ(2, message.repeated_lazy_message_size());
  ASSERT_EQ(2, message.repeated_nested_enum_size());
  ASSERT_EQ(2, message.repeated_foreign_enum_size());
  ASSERT_EQ(2, message.repeated_import_enum_size());


  EXPECT_EQ(201, message.repeated_int32(0));
  EXPECT_EQ(202, message.repeated_int64(0));
  EXPECT_EQ(203, message.repeated_uint32(0));
  EXPECT_EQ(204, message.repeated_uint64(0));
  EXPECT_EQ(205, message.repeated_sint32(0));
  EXPECT_EQ(206, message.repeated_sint64(0));
  EXPECT_EQ(207, message.repeated_fixed32(0));
  EXPECT_EQ(208, message.repeated_fixed64(0));
  EXPECT_EQ(209, message.repeated_sfixed32(0));
  EXPECT_EQ(210, message.repeated_sfixed64(0));
  EXPECT_EQ(211, message.repeated_float(0));
  EXPECT_EQ(212, message.repeated_double(0));
  EXPECT_EQ(true, message.repeated_bool(0));
  EXPECT_EQ("215", message.repeated_string(0));
  EXPECT_EQ("216", message.repeated_bytes(0));

  EXPECT_EQ(217, message.repeatedgroup(0).a());
  EXPECT_EQ(218, message.repeated_nested_message(0).bb());
  EXPECT_EQ(219, message.repeated_foreign_message(0).c());
  EXPECT_EQ(220, message.repeated_import_message(0).d());
  EXPECT_EQ(227, message.repeated_lazy_message(0).bb());


  EXPECT_EQ(unittest::TestAllTypesLite::BAR, message.repeated_nested_enum(0));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAR, message.repeated_foreign_enum(0));
  EXPECT_EQ(unittest_import::IMPORT_LITE_BAR, message.repeated_import_enum(0));

  EXPECT_EQ(301, message.repeated_int32(1));
  EXPECT_EQ(302, message.repeated_int64(1));
  EXPECT_EQ(303, message.repeated_uint32(1));
  EXPECT_EQ(304, message.repeated_uint64(1));
  EXPECT_EQ(305, message.repeated_sint32(1));
  EXPECT_EQ(306, message.repeated_sint64(1));
  EXPECT_EQ(307, message.repeated_fixed32(1));
  EXPECT_EQ(308, message.repeated_fixed64(1));
  EXPECT_EQ(309, message.repeated_sfixed32(1));
  EXPECT_EQ(310, message.repeated_sfixed64(1));
  EXPECT_EQ(311, message.repeated_float(1));
  EXPECT_EQ(312, message.repeated_double(1));
  // EXPECT_EQ(false, ...) triggers a compiler warning in some platforms.
  //   warning: converting ‘false’ to pointer type
  EXPECT_FALSE(message.repeated_bool(1));
  EXPECT_EQ("315", message.repeated_string(1));
  EXPECT_EQ("316", message.repeated_bytes(1));

  EXPECT_EQ(317, message.repeatedgroup(1).a());
  EXPECT_EQ(318, message.repeated_nested_message(1).bb());
  EXPECT_EQ(319, message.repeated_foreign_message(1).c());
  EXPECT_EQ(320, message.repeated_import_message(1).d());
  EXPECT_EQ(327, message.repeated_lazy_message(1).bb());

  EXPECT_EQ(unittest::TestAllTypesLite::BAZ, message.repeated_nested_enum(1));
  EXPECT_EQ(unittest::FOREIGN_LITE_BAZ, message.repeated_foreign_enum(1));
  EXPECT_EQ(unittest_import::IMPORT_LITE_BAZ, message.repeated_import_enum(1));


  // -----------------------------------------------------------------

  EXPECT_TRUE(message.has_default_int32());
  EXPECT_TRUE(message.has_default_int64());
  EXPECT_TRUE(message.has_default_uint32());
  EXPECT_TRUE(message.has_default_uint64());
  EXPECT_TRUE(message.has_default_sint32());
  EXPECT_TRUE(message.has_default_sint64());
  EXPECT_TRUE(message.has_default_fixed32());
  EXPECT_TRUE(message.has_default_fixed64());
  EXPECT_TRUE(message.has_default_sfixed32());
  EXPECT_TRUE(message.has_default_sfixed64());
  EXPECT_TRUE(message.has_default_float());
  EXPECT_TRUE(message.has_default_double());
  EXPECT_TRUE(message.has_default_bool());
  EXPECT_TRUE(message.has_default_string());
  EXPECT_TRUE(message.has_default_bytes());

  EXPECT_TRUE(message.has_default_nested_enum());
  EXPECT_TRUE(message.has_default_foreign_enum());
  EXPECT_TRUE(message.has_default_import_enum());


  EXPECT_EQ(401, message.default_int32());
  EXPECT_EQ(402, message.default_int64());
  EXPECT_EQ(403, message.default_uint32());
  EXPECT_EQ(404, message.default_uint64());
  EXPECT_EQ(405, message.default_sint32());
  EXPECT_EQ(406, message.default_sint64());
  EXPECT_EQ(407, message.default_fixed32());
  EXPECT_EQ(408, message.default_fixed64());
  EXPECT_EQ(409, message.default_sfixed32());
  EXPECT_EQ(410, message.default_sfixed64());
  EXPECT_EQ(411, message.default_float());
  EXPECT_EQ(412, message.default_double());
  EXPECT_FALSE(message.default_bool());
  EXPECT_EQ("415", message.default_string());
  EXPECT_EQ("416", message.default_bytes());

  EXPECT_EQ(unittest::TestAllTypesLite::FOO, message.default_nested_enum());
  EXPECT_EQ(unittest::FOREIGN_LITE_FOO, message.default_foreign_enum());
  EXPECT_EQ(unittest_import::IMPORT_LITE_FOO, message.default_import_enum());


  EXPECT_FALSE(message.has_oneof_uint32());
  EXPECT_FALSE(message.has_oneof_nested_message());
  EXPECT_FALSE(message.has_oneof_string());
  EXPECT_TRUE(message.has_oneof_bytes());

  EXPECT_EQ("604", message.oneof_bytes());
}